

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::genDependentAggLoopString
          (string *__return_storage_ptr__,CppGenerator *this,TDNode *node,size_t currentLoop,
          size_t depth,dyn_bitset *contributingViews,size_t maxDepth,string *resetString)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pDVar7;
  pointer pcVar8;
  size_t *psVar9;
  pointer pvVar10;
  pointer pAVar11;
  dyn_bitset *__val;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  char cVar12;
  bool bVar13;
  pointer pbVar14;
  long *plVar15;
  undefined8 *puVar16;
  size_t sVar17;
  View *pVVar18;
  Attribute *pAVar19;
  View *pVVar20;
  ulong *puVar21;
  size_type *psVar22;
  long *plVar23;
  undefined8 *puVar24;
  dyn_bitset *pdVar25;
  size_t stringOffset;
  long lVar26;
  pointer pAVar27;
  ulong uVar28;
  char cVar29;
  char cVar30;
  undefined8 uVar31;
  string *psVar32;
  string *psVar33;
  size_t *psVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  pointer pAVar38;
  byte bVar39;
  string local_620;
  string __str_2;
  string closeLoopString;
  size_t off;
  size_type local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  string __str_1;
  string loopString;
  string __str_14;
  string productString;
  ulong *local_4b0;
  long local_4a8;
  ulong local_4a0;
  long lStack_498;
  long *local_490;
  long local_488;
  long local_480;
  long lStack_478;
  long local_470;
  unsigned_long local_468;
  ulong *local_460;
  long local_458;
  ulong local_450;
  long lStack_448;
  ulong *local_440;
  long local_438;
  ulong local_430;
  undefined8 uStack_428;
  TDNode *local_420;
  ulong *local_418;
  long local_410;
  ulong local_408;
  long lStack_400;
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong *local_3b8;
  long local_3b0;
  ulong local_3a8;
  undefined8 uStack_3a0;
  string depthString;
  ulong *local_378;
  long local_370;
  ulong local_368;
  long lStack_360;
  ulong *local_358;
  long local_350;
  ulong local_348;
  long lStack_340;
  ulong *local_338;
  long local_330;
  ulong local_328;
  long lStack_320;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  ulong *local_298;
  long local_290;
  ulong local_288;
  long lStack_280;
  ulong *local_278;
  long local_270;
  ulong local_268;
  long lStack_260;
  ulong *local_258;
  long local_250;
  ulong local_248;
  long lStack_240;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  size_type local_218;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  size_t outViewID;
  long local_168;
  long local_160;
  long lStack_158;
  pointer local_150;
  long local_148;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long local_100;
  dyn_bitset *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  ulong local_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0 [2];
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  size_t local_60;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar39 = 0;
  local_150 = (this->depListOfLoops).
              super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_100 = currentLoop * 0x138;
  pDVar7 = local_150 + currentLoop;
  local_420 = node;
  local_f8 = contributingViews;
  local_218 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                        (&pDVar7->loopFactors);
  local_f0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  cVar29 = '\x01';
  if (9 < depth) {
    sVar17 = depth;
    cVar30 = '\x04';
    do {
      cVar29 = cVar30;
      if (sVar17 < 100) {
        cVar29 = cVar29 + -2;
        goto LAB_0024459b;
      }
      if (sVar17 < 1000) {
        cVar29 = cVar29 + -1;
        goto LAB_0024459b;
      }
      if (sVar17 < 10000) goto LAB_0024459b;
      bVar13 = 99999 < sVar17;
      sVar17 = sVar17 / 10000;
      cVar30 = cVar29 + '\x04';
    } while (bVar13);
    cVar29 = cVar29 + '\x01';
  }
LAB_0024459b:
  depthString._M_dataplus._M_p = (pointer)&depthString.field_2;
  local_468 = depth;
  local_58 = &pDVar7->loopFactors;
  std::__cxx11::string::_M_construct((ulong)&depthString,cVar29);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (depthString._M_dataplus._M_p,(uint)depthString._M_string_length,local_468);
  pvVar5 = (this->localProductList).
           super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar14 = pvVar5[currentLoop].
            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar5[currentLoop].
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data + 8) != pbVar14) {
    local_470 = (local_218 + local_468) * 3 + 9;
    uVar36 = 0;
    do {
      genProductString_abi_cxx11_(&productString,this,local_420,local_f8,pbVar14 + uVar36);
      __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_14,(char)local_470);
      plVar15 = (long *)std::__cxx11::string::append((char *)&__str_14);
      puVar21 = (ulong *)(plVar15 + 2);
      if ((ulong *)*plVar15 == puVar21) {
        local_5a8._M_allocated_capacity = *puVar21;
        local_5a8._8_8_ = plVar15[3];
        off = (size_t)&local_5a8;
      }
      else {
        local_5a8._M_allocated_capacity = *puVar21;
        off = (size_t)*plVar15;
      }
      local_5b0 = plVar15[1];
      *plVar15 = (long)puVar21;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      uVar28 = this->productCounter;
      cVar29 = '\x01';
      if (9 < uVar28) {
        uVar35 = uVar28;
        cVar30 = '\x04';
        do {
          cVar29 = cVar30;
          if (uVar35 < 100) {
            cVar29 = cVar29 + -2;
            goto LAB_00244748;
          }
          if (uVar35 < 1000) {
            cVar29 = cVar29 + -1;
            goto LAB_00244748;
          }
          if (uVar35 < 10000) goto LAB_00244748;
          bVar13 = 99999 < uVar35;
          uVar35 = uVar35 / 10000;
          cVar30 = cVar29 + '\x04';
        } while (bVar13);
        cVar29 = cVar29 + '\x01';
      }
LAB_00244748:
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_1,cVar29);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar28);
      uVar31 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)off != &local_5a8) {
        uVar31 = local_5a8._M_allocated_capacity;
      }
      if ((ulong)uVar31 < __str_1._M_string_length + local_5b0) {
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          uVar31 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < __str_1._M_string_length + local_5b0) goto LAB_002447d6;
        puVar16 = (undefined8 *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,off);
      }
      else {
LAB_002447d6:
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&off,(ulong)__str_1._M_dataplus._M_p);
      }
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      psVar22 = puVar16 + 2;
      if ((size_type *)*puVar16 == psVar22) {
        __str_2.field_2._M_allocated_capacity = *psVar22;
        __str_2.field_2._8_8_ = puVar16[3];
      }
      else {
        __str_2.field_2._M_allocated_capacity = *psVar22;
        __str_2._M_dataplus._M_p = (pointer)*puVar16;
      }
      __str_2._M_string_length = puVar16[1];
      *puVar16 = psVar22;
      puVar16[1] = 0;
      *(char *)psVar22 = '\0';
      plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
      local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
      psVar22 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar22) {
        local_620.field_2._M_allocated_capacity = *psVar22;
        local_620.field_2._8_8_ = plVar15[3];
      }
      else {
        local_620.field_2._M_allocated_capacity = *psVar22;
        local_620._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_620._M_string_length = plVar15[1];
      *plVar15 = (long)psVar22;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_620,(ulong)productString._M_dataplus._M_p);
      psVar22 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar22) {
        closeLoopString.field_2._M_allocated_capacity = *psVar22;
        closeLoopString.field_2._8_8_ = plVar15[3];
        closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
      }
      else {
        closeLoopString.field_2._M_allocated_capacity = *psVar22;
        closeLoopString._M_dataplus._M_p = (pointer)*plVar15;
      }
      closeLoopString._M_string_length = plVar15[1];
      *plVar15 = (long)psVar22;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
      psVar22 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar22) {
        loopString.field_2._M_allocated_capacity = *psVar22;
        loopString.field_2._8_8_ = plVar15[3];
        loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
      }
      else {
        loopString.field_2._M_allocated_capacity = *psVar22;
        loopString._M_dataplus._M_p = (pointer)*plVar15;
      }
      loopString._M_string_length = plVar15[1];
      *plVar15 = (long)psVar22;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)loopString._M_dataplus._M_p != &loopString.field_2) {
        operator_delete(loopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
        operator_delete(closeLoopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_620._M_dataplus._M_p != &local_620.field_2) {
        operator_delete(local_620._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)off != &local_5a8) {
        operator_delete((void *)off);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
        operator_delete(__str_14._M_dataplus._M_p);
      }
      *(size_t *)
       (*(long *)&(this->depLocalProductRemapping).
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data + uVar36 * 8) = this->productCounter;
      this->productCounter = this->productCounter + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)productString._M_dataplus._M_p != &productString.field_2) {
        operator_delete(productString._M_dataplus._M_p);
      }
      uVar36 = uVar36 + 1;
      pvVar5 = (this->localProductList).
               super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar14 = pvVar5[currentLoop].
                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar36 < (ulong)(((long)*(pointer *)
                                      ((long)&pvVar5[currentLoop].
                                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                              ._M_impl.super__Vector_impl_data + 8) - (long)pbVar14
                              >> 6) * -0x5555555555555555));
  }
  pvVar6 = (this->newAggregateRegister).
           super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar27 = pvVar6[currentLoop].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar6[currentLoop].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
               _M_impl.super__Vector_impl_data + 8) != pAVar27) {
    local_470 = (local_218 + local_468) * 3 + 9;
    uVar36 = 0;
    do {
      if (pAVar27[uVar36].preLoopAgg == true) {
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_620,(char)local_470);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_620);
        closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          closeLoopString.field_2._M_allocated_capacity = *psVar22;
          closeLoopString.field_2._8_8_ = plVar15[3];
        }
        else {
          closeLoopString.field_2._M_allocated_capacity = *psVar22;
          closeLoopString._M_dataplus._M_p = (pointer)*plVar15;
        }
        closeLoopString._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar28 = this->aggregateCounter;
        cVar29 = '\x01';
        if (9 < uVar28) {
          uVar35 = uVar28;
          cVar30 = '\x04';
          do {
            cVar29 = cVar30;
            if (uVar35 < 100) {
              cVar29 = cVar29 + -2;
              goto LAB_00244bab;
            }
            if (uVar35 < 1000) {
              cVar29 = cVar29 + -1;
              goto LAB_00244bab;
            }
            if (uVar35 < 10000) goto LAB_00244bab;
            bVar13 = 99999 < uVar35;
            uVar35 = uVar35 / 10000;
            cVar30 = cVar29 + '\x04';
          } while (bVar13);
          cVar29 = cVar29 + '\x01';
        }
LAB_00244bab:
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str_2,cVar29);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar28);
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          uVar31 = closeLoopString.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < __str_2._M_string_length + closeLoopString._M_string_length) {
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            uVar31 = __str_2.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < __str_2._M_string_length + closeLoopString._M_string_length)
          goto LAB_00244c20;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&__str_2,0,(char *)0x0,(ulong)closeLoopString._M_dataplus._M_p
                              );
        }
        else {
LAB_00244c20:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&closeLoopString,(ulong)__str_2._M_dataplus._M_p);
        }
        psVar22 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar22) {
          loopString.field_2._M_allocated_capacity = *psVar22;
          loopString.field_2._8_8_ = puVar16[3];
          loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar22;
          loopString._M_dataplus._M_p = (pointer)*puVar16;
        }
        loopString._M_string_length = puVar16[1];
        *puVar16 = psVar22;
        puVar16[1] = 0;
        *(char *)psVar22 = '\0';
        plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          productString.field_2._M_allocated_capacity = *psVar22;
          productString.field_2._8_8_ = plVar15[3];
        }
        else {
          productString.field_2._M_allocated_capacity = *psVar22;
          productString._M_dataplus._M_p = (pointer)*plVar15;
        }
        productString._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          operator_delete(closeLoopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        pAVar27 = pAVar27 + uVar36;
        paVar1 = &closeLoopString.field_2;
        if ((pAVar27->previous).first <
            (ulong)(((long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97)) {
          uVar28 = *(ulong *)(*(long *)&(this->depAggregateRemapping).
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [(pAVar27->previous).first].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data +
                             (pAVar27->previous).second * 8);
          cVar29 = '\x01';
          if (9 < uVar28) {
            uVar35 = uVar28;
            cVar30 = '\x04';
            do {
              cVar29 = cVar30;
              if (uVar35 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_00244e2a;
              }
              if (uVar35 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_00244e2a;
              }
              if (uVar35 < 10000) goto LAB_00244e2a;
              bVar13 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar30 = cVar29 + '\x04';
            } while (bVar13);
            cVar29 = cVar29 + '\x01';
          }
LAB_00244e2a:
          productString._M_dataplus._M_p = (pointer)&productString.field_2;
          std::__cxx11::string::_M_construct((ulong)&productString,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar28);
          std::operator+(&closeLoopString,"aggregateRegister[",&productString);
          plVar15 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString.field_2._8_8_ = plVar15[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString._M_dataplus._M_p = (pointer)*plVar15;
          }
          loopString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != paVar1) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
        }
        if ((pAVar27->product).first == true) {
          uVar28 = *(ulong *)(*(long *)&(this->depLocalProductRemapping).
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data +
                             (pAVar27->product).second * 8);
          cVar29 = '\x01';
          if (9 < uVar28) {
            uVar35 = uVar28;
            cVar30 = '\x04';
            do {
              cVar29 = cVar30;
              if (uVar35 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_00244fbd;
              }
              if (uVar35 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_00244fbd;
              }
              if (uVar35 < 10000) goto LAB_00244fbd;
              bVar13 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar30 = cVar29 + '\x04';
            } while (bVar13);
            cVar29 = cVar29 + '\x01';
          }
LAB_00244fbd:
          productString._M_dataplus._M_p = (pointer)&productString.field_2;
          std::__cxx11::string::_M_construct((ulong)&productString,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar28);
          std::operator+(&closeLoopString,"localRegister[",&productString);
          plVar15 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString.field_2._8_8_ = plVar15[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString._M_dataplus._M_p = (pointer)*plVar15;
          }
          loopString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != paVar1) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
        }
        if (pAVar27->singleViewAgg == true) {
          std::operator+(&local_620,"aggregates_",this->viewName + (pAVar27->viewAgg).first);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_620);
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            closeLoopString.field_2._M_allocated_capacity = *psVar22;
            closeLoopString.field_2._8_8_ = plVar15[3];
            closeLoopString._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            closeLoopString.field_2._M_allocated_capacity = *psVar22;
            closeLoopString._M_dataplus._M_p = (pointer)*plVar15;
          }
          closeLoopString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          uVar28 = (pAVar27->viewAgg).second;
          cVar29 = '\x01';
          if (9 < uVar28) {
            uVar35 = uVar28;
            cVar30 = '\x04';
            do {
              cVar29 = cVar30;
              if (uVar35 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_002451ad;
              }
              if (uVar35 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_002451ad;
              }
              if (uVar35 < 10000) goto LAB_002451ad;
              bVar13 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar30 = cVar29 + '\x04';
            } while (bVar13);
            cVar29 = cVar29 + '\x01';
          }
LAB_002451ad:
          __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str_2,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar28);
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != paVar1) {
            uVar31 = closeLoopString.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < __str_2._M_string_length + closeLoopString._M_string_length) {
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              uVar31 = __str_2.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar31 < __str_2._M_string_length + closeLoopString._M_string_length)
            goto LAB_0024521d;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&__str_2,0,(char *)0x0,
                                 (ulong)closeLoopString._M_dataplus._M_p);
          }
          else {
LAB_0024521d:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&closeLoopString,(ulong)__str_2._M_dataplus._M_p);
          }
          psVar22 = puVar16 + 2;
          if ((size_type *)*puVar16 == psVar22) {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString.field_2._8_8_ = puVar16[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString._M_dataplus._M_p = (pointer)*puVar16;
          }
          loopString._M_string_length = puVar16[1];
          *puVar16 = psVar22;
          puVar16[1] = 0;
          *(char *)psVar22 = '\0';
          plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            productString.field_2._M_allocated_capacity = *psVar22;
            productString.field_2._8_8_ = plVar15[3];
            productString._M_dataplus._M_p = (pointer)&productString.field_2;
          }
          else {
            productString.field_2._M_allocated_capacity = *psVar22;
            productString._M_dataplus._M_p = (pointer)*plVar15;
          }
          productString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            operator_delete(__str_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != paVar1) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_620._M_dataplus._M_p != &local_620.field_2) {
            operator_delete(local_620._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::pop_back();
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        *(size_t *)
         (*(long *)&(this->depAggregateRemapping).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + uVar36 * 8) = this->aggregateCounter;
        this->aggregateCounter = this->aggregateCounter + 1;
      }
      uVar36 = uVar36 + 1;
      pvVar6 = (this->newAggregateRegister).
               super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar27 = pvVar6[currentLoop].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar36 < (ulong)(((long)*(pointer *)
                                      ((long)&pvVar6[currentLoop].
                                              super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                              ._M_impl.super__Vector_impl_data + 8) - (long)pAVar27
                              >> 4) * 0x6db6db6db6db6db7));
  }
  local_150 = (pointer)((long)(local_150->branchFunctions).super__Base_bitset<24UL>._M_w +
                       local_100 + -0x78);
  lVar26 = *(long *)((long)local_150 + 0x18);
  if (*(long *)((long)local_150 + 0x20) != lVar26) {
    local_470 = (local_218 + local_468) * 3 + 9;
    local_148 = (local_218 + local_468) * 3 + 0xc;
    local_e8 = 0;
    do {
      b = local_58;
      sVar17 = *(size_t *)(lVar26 + local_e8 * 8);
      pDVar7 = (this->depListOfLoops).
               super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_60 = sVar17;
      boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       &productString,&pDVar7[sVar17].loopFactors,local_58);
      bVar13 = boost::operator==((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &productString,b);
      local_100 = CONCAT71(local_100._1_7_,bVar13);
      if (productString._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(productString._M_dataplus._M_p);
      }
      if ((char)local_100 == '\0') break;
      uVar36 = pDVar7[sVar17].loopVariable;
      productString._M_dataplus._M_p = (pointer)&productString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&productString,"","");
      loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&loopString,"","");
      closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&closeLoopString,"","");
      sVar17 = QueryCompiler::numberOfViews
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      if (uVar36 < sVar17) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct((ulong)local_50,(char)local_470);
        plVar15 = (long *)std::__cxx11::string::append((char *)local_50);
        outViewID = (size_t)&local_160;
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_160 = *plVar23;
          lStack_158 = plVar15[3];
        }
        else {
          local_160 = *plVar23;
          outViewID = (size_t)*plVar15;
        }
        local_168 = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&outViewID,
                                     (ulong)this->viewName[uVar36]._M_dataplus._M_p);
        local_140 = &local_130;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_130 = *puVar21;
          lStack_128 = plVar15[3];
        }
        else {
          local_130 = *puVar21;
          local_140 = (ulong *)*plVar15;
        }
        local_138 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_378 = &local_368;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_368 = *puVar21;
          lStack_360 = plVar15[3];
        }
        else {
          local_368 = *puVar21;
          local_378 = (ulong *)*plVar15;
        }
        local_370 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_378,
                                     (ulong)this->viewName[uVar36]._M_dataplus._M_p);
        local_358 = &local_348;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_348 = *puVar21;
          lStack_340 = plVar15[3];
        }
        else {
          local_348 = *puVar21;
          local_358 = (ulong *)*plVar15;
        }
        local_350 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_358);
        local_2b8 = &local_2a8;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_2a8 = *puVar21;
          lStack_2a0 = plVar15[3];
        }
        else {
          local_2a8 = *puVar21;
          local_2b8 = (ulong *)*plVar15;
        }
        local_2b0 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_2b8,(ulong)depthString._M_dataplus._M_p);
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_110 = *plVar23;
          lStack_108 = plVar15[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar23;
          local_120 = (long *)*plVar15;
        }
        local_118 = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_228 = *puVar21;
          lStack_220 = puVar16[3];
          local_238 = &local_228;
        }
        else {
          local_228 = *puVar21;
          local_238 = (ulong *)*puVar16;
        }
        local_230 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_80 = local_70;
        std::__cxx11::string::_M_construct((ulong)&local_80,(char)local_470);
        uVar28 = 0xf;
        if (local_238 != &local_228) {
          uVar28 = local_228;
        }
        if (uVar28 < (ulong)(local_78 + local_230)) {
          uVar28 = 0xf;
          if (local_80 != local_70) {
            uVar28 = local_70[0];
          }
          if (uVar28 < (ulong)(local_78 + local_230)) goto LAB_00245c31;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_238);
        }
        else {
LAB_00245c31:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_80);
        }
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_200 = *puVar24;
          uStack_1f8 = puVar16[3];
          local_210 = &local_200;
        }
        else {
          local_200 = *puVar24;
          local_210 = (undefined8 *)*puVar16;
        }
        local_208 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)puVar24 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_1c0 = *plVar15;
          lStack_1b8 = puVar16[3];
          local_1d0 = &local_1c0;
        }
        else {
          local_1c0 = *plVar15;
          local_1d0 = (long *)*puVar16;
        }
        local_1c8 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1d0,(ulong)this->viewName[uVar36]._M_dataplus._M_p);
        local_1f0 = &local_1e0;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_1e0 = *plVar15;
          lStack_1d8 = puVar16[3];
        }
        else {
          local_1e0 = *plVar15;
          local_1f0 = (long *)*puVar16;
        }
        local_1e8 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_1f0);
        local_1b0 = &local_1a0;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_1a0 = *plVar15;
          lStack_198 = puVar16[3];
        }
        else {
          local_1a0 = *plVar15;
          local_1b0 = (long *)*puVar16;
        }
        local_1a8 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1b0,(ulong)this->viewName[uVar36]._M_dataplus._M_p);
        local_338 = &local_328;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_328 = *puVar21;
          lStack_320 = puVar16[3];
        }
        else {
          local_328 = *puVar21;
          local_338 = (ulong *)*puVar16;
        }
        local_330 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_338);
        local_440 = &local_430;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_430 = *puVar21;
          uStack_428 = puVar16[3];
        }
        else {
          local_430 = *puVar21;
          local_440 = (ulong *)*puVar16;
        }
        local_438 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_440,(ulong)depthString._M_dataplus._M_p);
        local_318 = &local_308;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_308 = *puVar24;
          uStack_300 = puVar16[3];
        }
        else {
          local_308 = *puVar24;
          local_318 = (undefined8 *)*puVar16;
        }
        local_310 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_318);
        local_298 = &local_288;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_288 = *puVar21;
          lStack_280 = plVar15[3];
        }
        else {
          local_288 = *puVar21;
          local_298 = (ulong *)*plVar15;
        }
        local_290 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_a0 = local_90;
        std::__cxx11::string::_M_construct((ulong)&local_a0,(char)local_470);
        uVar28 = 0xf;
        if (local_298 != &local_288) {
          uVar28 = local_288;
        }
        if (uVar28 < (ulong)(local_98 + local_290)) {
          uVar28 = 0xf;
          if (local_a0 != local_90) {
            uVar28 = local_90[0];
          }
          if (uVar28 < (ulong)(local_98 + local_290)) goto LAB_002460e5;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_298);
        }
        else {
LAB_002460e5:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_298,(ulong)local_a0);
        }
        local_2f8 = &local_2e8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_2e8 = *puVar24;
          uStack_2e0 = puVar16[3];
        }
        else {
          local_2e8 = *puVar24;
          local_2f8 = (undefined8 *)*puVar16;
        }
        local_2f0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)puVar24 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
        local_278 = &local_268;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_268 = *puVar21;
          lStack_260 = puVar16[3];
        }
        else {
          local_268 = *puVar21;
          local_278 = (ulong *)*puVar16;
        }
        local_270 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_c0 = local_b0;
        std::__cxx11::string::_M_construct((ulong)&local_c0,(char)local_148);
        uVar28 = 0xf;
        if (local_278 != &local_268) {
          uVar28 = local_268;
        }
        if (uVar28 < (ulong)(local_b8 + local_270)) {
          uVar28 = 0xf;
          if (local_c0 != local_b0) {
            uVar28 = local_b0[0];
          }
          if (uVar28 < (ulong)(local_b8 + local_270)) goto LAB_00246664;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_278);
        }
        else {
LAB_00246664:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_c0);
        }
        local_3b8 = &local_3a8;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_3a8 = *puVar21;
          uStack_3a0 = puVar16[3];
        }
        else {
          local_3a8 = *puVar21;
          local_3b8 = (ulong *)*puVar16;
        }
        local_3b0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3b8,(ulong)this->viewName[uVar36]._M_dataplus._M_p);
        local_3d8 = &local_3c8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_3c8 = *puVar24;
          uStack_3c0 = puVar16[3];
        }
        else {
          local_3c8 = *puVar24;
          local_3d8 = (undefined8 *)*puVar16;
        }
        local_3d0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
        local_190 = &local_180;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_180 = *plVar15;
          lStack_178 = puVar16[3];
        }
        else {
          local_180 = *plVar15;
          local_190 = (long *)*puVar16;
        }
        local_188 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_190,(ulong)this->viewName[uVar36]._M_dataplus._M_p);
        local_258 = &local_248;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_248 = *puVar21;
          lStack_240 = puVar16[3];
        }
        else {
          local_248 = *puVar21;
          local_258 = (ulong *)*puVar16;
        }
        local_250 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
        local_2d8 = &local_2c8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_2c8 = *puVar24;
          uStack_2c0 = puVar16[3];
        }
        else {
          local_2c8 = *puVar24;
          local_2d8 = (undefined8 *)*puVar16;
        }
        local_2d0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2d8,(ulong)this->viewName[uVar36]._M_dataplus._M_p);
        local_418 = &local_408;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_408 = *puVar21;
          lStack_400 = puVar16[3];
        }
        else {
          local_408 = *puVar21;
          local_418 = (ulong *)*puVar16;
        }
        local_410 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_418);
        local_3f8 = &local_3e8;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_3e8 = *puVar21;
          uStack_3e0 = puVar16[3];
        }
        else {
          local_3e8 = *puVar21;
          local_3f8 = (ulong *)*puVar16;
        }
        local_3f0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_3f8,
                                     (ulong)this->viewName[uVar36]._M_dataplus._M_p);
        local_4b0 = &local_4a0;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_4a0 = *puVar21;
          lStack_498 = plVar15[3];
        }
        else {
          local_4a0 = *puVar21;
          local_4b0 = (ulong *)*plVar15;
        }
        local_4a8 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_4b0);
        local_460 = &local_450;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_450 = *puVar21;
          lStack_448 = plVar15[3];
        }
        else {
          local_450 = *puVar21;
          local_460 = (ulong *)*plVar15;
        }
        local_458 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_e0 = local_d0;
        std::__cxx11::string::_M_construct((ulong)&local_e0,(char)local_148);
        uVar28 = 0xf;
        if (local_460 != &local_450) {
          uVar28 = local_450;
        }
        if (uVar28 < (ulong)(local_d8 + local_458)) {
          uVar28 = 0xf;
          if (local_e0 != local_d0) {
            uVar28 = local_d0[0];
          }
          if (uVar28 < (ulong)(local_d8 + local_458)) goto LAB_00246c57;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_460);
        }
        else {
LAB_00246c57:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_e0);
        }
        local_490 = &local_480;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_480 = *plVar15;
          lStack_478 = puVar16[3];
        }
        else {
          local_480 = *plVar15;
          local_490 = (long *)*puVar16;
        }
        local_488 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)plVar15 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_490);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_1._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_1,(ulong)this->viewName[uVar36]._M_dataplus._M_p
                                    );
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_14._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&__str_14);
        off = (size_t)&local_5a8;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          local_5a8._M_allocated_capacity = *psVar22;
          local_5a8._8_8_ = plVar15[3];
        }
        else {
          local_5a8._M_allocated_capacity = *psVar22;
          off = (size_t)*plVar15;
        }
        local_5b0 = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&off,(ulong)this->viewName[uVar36]._M_dataplus._M_p);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_2._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620.field_2._8_8_ = plVar15[3];
        }
        else {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_620._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&loopString,(ulong)local_620._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_5a8) {
          operator_delete((void *)off);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_490 != &local_480) {
          operator_delete(local_490);
        }
        if (local_e0 != local_d0) {
          operator_delete(local_e0);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_4b0 != &local_4a0) {
          operator_delete(local_4b0);
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8);
        }
        if (local_418 != &local_408) {
          operator_delete(local_418);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8);
        }
        if (local_258 != &local_248) {
          operator_delete(local_258);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if (local_3d8 != &local_3c8) {
          operator_delete(local_3d8);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8);
        }
        if (local_c0 != local_b0) {
          operator_delete(local_c0);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
        if (local_298 != &local_288) {
          operator_delete(local_298);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0);
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210);
        }
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        if (local_238 != &local_228) {
          operator_delete(local_238);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140);
        }
        if ((long *)outViewID != &local_160) {
          operator_delete((void *)outViewID);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        local_460 = &local_450;
        std::__cxx11::string::_M_construct((ulong)&local_460,(char)local_148);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_480 = *plVar15;
          lStack_478 = puVar16[3];
          local_490 = &local_480;
        }
        else {
          local_480 = *plVar15;
          local_490 = (long *)*puVar16;
        }
        local_488 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_490,
                                     (ulong)this->viewName[uVar36]._M_dataplus._M_p);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_1._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&__str_1);
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_14._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_4b0 = &local_4a0;
        std::__cxx11::string::_M_construct((ulong)&local_4b0,(char)local_470);
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          uVar31 = __str_14.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < local_4a8 + __str_14._M_string_length) {
          uVar36 = 0xf;
          if (local_4b0 != &local_4a0) {
            uVar36 = local_4a0;
          }
          if (uVar36 < local_4a8 + __str_14._M_string_length) goto LAB_00247d0a;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_4b0,0,(char *)0x0,(ulong)__str_14._M_dataplus._M_p);
        }
        else {
LAB_00247d0a:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&__str_14,(ulong)local_4b0);
        }
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_5a8._M_allocated_capacity = *puVar21;
          local_5a8._8_8_ = puVar16[3];
          off = (size_t)&local_5a8;
        }
        else {
          local_5a8._M_allocated_capacity = *puVar21;
          off = (size_t)*puVar16;
        }
        local_5b0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)puVar21 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&off);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_2._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_2,(ulong)closeLoopString._M_dataplus._M_p);
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620.field_2._8_8_ = plVar15[3];
        }
        else {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_620._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&closeLoopString,(ulong)local_620._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_5a8) {
          operator_delete((void *)off);
        }
        if (local_4b0 != &local_4a0) {
          operator_delete(local_4b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_490 != &local_480) {
          operator_delete(local_490);
        }
        sVar17 = local_60;
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
      }
      else {
        local_120 = &local_110;
        std::__cxx11::string::_M_construct((ulong)&local_120,(char)local_470);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_120);
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_228 = *puVar21;
          lStack_220 = plVar15[3];
          local_238 = &local_228;
        }
        else {
          local_228 = *puVar21;
          local_238 = (ulong *)*plVar15;
        }
        local_230 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_238,(ulong)(local_420->_name)._M_dataplus._M_p);
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_200 = *puVar24;
          uStack_1f8 = puVar16[3];
          local_210 = &local_200;
        }
        else {
          local_200 = *puVar24;
          local_210 = (undefined8 *)*puVar16;
        }
        local_208 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_210);
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_1c0 = *plVar23;
          lStack_1b8 = plVar15[3];
          local_1d0 = &local_1c0;
        }
        else {
          local_1c0 = *plVar23;
          local_1d0 = (long *)*plVar15;
        }
        local_1c8 = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_1d0,(ulong)(local_420->_name)._M_dataplus._M_p);
        local_1f0 = &local_1e0;
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_1e0 = *plVar23;
          lStack_1d8 = plVar15[3];
        }
        else {
          local_1e0 = *plVar23;
          local_1f0 = (long *)*plVar15;
        }
        local_1e8 = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_1f0);
        local_1b0 = &local_1a0;
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_1a0 = *plVar23;
          lStack_198 = plVar15[3];
        }
        else {
          local_1a0 = *plVar23;
          local_1b0 = (long *)*plVar15;
        }
        local_1a8 = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_1b0,(ulong)depthString._M_dataplus._M_p);
        local_338 = &local_328;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_328 = *puVar21;
          lStack_320 = plVar15[3];
        }
        else {
          local_328 = *puVar21;
          local_338 = (ulong *)*plVar15;
        }
        local_330 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_338);
        local_440 = &local_430;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_430 = *puVar21;
          uStack_428 = puVar16[3];
        }
        else {
          local_430 = *puVar21;
          local_440 = (ulong *)*puVar16;
        }
        local_438 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_2b8 = &local_2a8;
        std::__cxx11::string::_M_construct((ulong)&local_2b8,(char)local_470);
        uVar36 = 0xf;
        if (local_440 != &local_430) {
          uVar36 = local_430;
        }
        if (uVar36 < (ulong)(local_2b0 + local_438)) {
          uVar36 = 0xf;
          if (local_2b8 != &local_2a8) {
            uVar36 = local_2a8;
          }
          if (uVar36 < (ulong)(local_2b0 + local_438)) goto LAB_00245ce9;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_440);
        }
        else {
LAB_00245ce9:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_2b8);
        }
        local_318 = &local_308;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_308 = *puVar24;
          uStack_300 = puVar16[3];
        }
        else {
          local_308 = *puVar24;
          local_318 = (undefined8 *)*puVar16;
        }
        local_310 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)puVar24 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
        local_298 = &local_288;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_288 = *puVar21;
          lStack_280 = puVar16[3];
        }
        else {
          local_288 = *puVar21;
          local_298 = (ulong *)*puVar16;
        }
        local_290 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_298,(ulong)(local_420->_name)._M_dataplus._M_p);
        local_2f8 = &local_2e8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_2e8 = *puVar24;
          uStack_2e0 = puVar16[3];
        }
        else {
          local_2e8 = *puVar24;
          local_2f8 = (undefined8 *)*puVar16;
        }
        local_2f0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_2f8);
        local_278 = &local_268;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_268 = *puVar21;
          lStack_260 = plVar15[3];
        }
        else {
          local_268 = *puVar21;
          local_278 = (ulong *)*plVar15;
        }
        local_270 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_278,(ulong)(local_420->_name)._M_dataplus._M_p);
        local_3b8 = &local_3a8;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_3a8 = *puVar21;
          uStack_3a0 = puVar16[3];
        }
        else {
          local_3a8 = *puVar21;
          local_3b8 = (ulong *)*puVar16;
        }
        local_3b0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_3b8);
        local_3d8 = &local_3c8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_3c8 = *puVar24;
          uStack_3c0 = puVar16[3];
        }
        else {
          local_3c8 = *puVar24;
          local_3d8 = (undefined8 *)*puVar16;
        }
        local_3d0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_3d8,(ulong)depthString._M_dataplus._M_p);
        local_190 = &local_180;
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_180 = *plVar23;
          lStack_178 = plVar15[3];
        }
        else {
          local_180 = *plVar23;
          local_190 = (long *)*plVar15;
        }
        local_188 = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_190);
        local_258 = &local_248;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_248 = *puVar21;
          lStack_240 = plVar15[3];
        }
        else {
          local_248 = *puVar21;
          local_258 = (ulong *)*plVar15;
        }
        local_250 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_358 = &local_348;
        std::__cxx11::string::_M_construct((ulong)&local_358,(char)local_470);
        uVar36 = 0xf;
        if (local_258 != &local_248) {
          uVar36 = local_248;
        }
        if (uVar36 < (ulong)(local_350 + local_250)) {
          uVar36 = 0xf;
          if (local_358 != &local_348) {
            uVar36 = local_348;
          }
          if (uVar36 < (ulong)(local_350 + local_250)) goto LAB_002464ec;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,(ulong)local_258);
        }
        else {
LAB_002464ec:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_358);
        }
        local_2d8 = &local_2c8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_2c8 = *puVar24;
          uStack_2c0 = puVar16[3];
        }
        else {
          local_2c8 = *puVar24;
          local_2d8 = (undefined8 *)*puVar16;
        }
        local_2d0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)puVar24 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_2d8);
        local_418 = &local_408;
        puVar21 = (ulong *)(plVar15 + 2);
        if ((ulong *)*plVar15 == puVar21) {
          local_408 = *puVar21;
          lStack_400 = plVar15[3];
        }
        else {
          local_408 = *puVar21;
          local_418 = (ulong *)*plVar15;
        }
        local_410 = plVar15[1];
        *plVar15 = (long)puVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_378 = &local_368;
        std::__cxx11::string::_M_construct((ulong)&local_378,(char)local_148);
        uVar36 = 0xf;
        if (local_418 != &local_408) {
          uVar36 = local_408;
        }
        if (uVar36 < (ulong)(local_370 + local_410)) {
          uVar36 = 0xf;
          if (local_378 != &local_368) {
            uVar36 = local_368;
          }
          if (uVar36 < (ulong)(local_370 + local_410)) goto LAB_002467dc;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_418);
        }
        else {
LAB_002467dc:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_418,(ulong)local_378);
        }
        local_3f8 = &local_3e8;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_3e8 = *puVar21;
          uStack_3e0 = puVar16[3];
        }
        else {
          local_3e8 = *puVar21;
          local_3f8 = (ulong *)*puVar16;
        }
        local_3f0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3f8,(ulong)(local_420->_name)._M_dataplus._M_p);
        local_4b0 = &local_4a0;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_4a0 = *puVar21;
          lStack_498 = puVar16[3];
        }
        else {
          local_4a0 = *puVar21;
          local_4b0 = (ulong *)*puVar16;
        }
        local_4a8 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_4b0);
        local_460 = &local_450;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_450 = *puVar21;
          lStack_448 = puVar16[3];
        }
        else {
          local_450 = *puVar21;
          local_460 = (ulong *)*puVar16;
        }
        local_458 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_460,(ulong)(local_420->_name)._M_dataplus._M_p);
        local_490 = &local_480;
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_480 = *plVar23;
          lStack_478 = plVar15[3];
        }
        else {
          local_480 = *plVar23;
          local_490 = (long *)*plVar15;
        }
        local_488 = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_490);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_1._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_1,(ulong)(local_420->_name)._M_dataplus._M_p);
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_14._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&__str_14);
        off = (size_t)&local_5a8;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          local_5a8._M_allocated_capacity = *psVar22;
          local_5a8._8_8_ = plVar15[3];
        }
        else {
          local_5a8._M_allocated_capacity = *psVar22;
          off = (size_t)*plVar15;
        }
        local_5b0 = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&off,(ulong)(local_420->_name)._M_dataplus._M_p);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_2._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620.field_2._8_8_ = plVar15[3];
        }
        else {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_620._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&loopString,(ulong)local_620._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_5a8) {
          operator_delete((void *)off);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_490 != &local_480) {
          operator_delete(local_490);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_4b0 != &local_4a0) {
          operator_delete(local_4b0);
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_418 != &local_408) {
          operator_delete(local_418);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358);
        }
        if (local_258 != &local_248) {
          operator_delete(local_258);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if (local_3d8 != &local_3c8) {
          operator_delete(local_3d8);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8);
        }
        if (local_298 != &local_288) {
          operator_delete(local_298);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0);
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210);
        }
        if (local_238 != &local_228) {
          operator_delete(local_238);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120);
        }
        local_460 = &local_450;
        std::__cxx11::string::_M_construct((ulong)&local_460,(char)local_148);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_460);
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_480 = *plVar15;
          lStack_478 = puVar16[3];
          local_490 = &local_480;
        }
        else {
          local_480 = *plVar15;
          local_490 = (long *)*puVar16;
        }
        local_488 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_490,(ulong)(local_420->_name)._M_dataplus._M_p);
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1.field_2._8_8_ = plVar15[3];
          __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_1._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&__str_1);
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_14._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_4b0 = &local_4a0;
        std::__cxx11::string::_M_construct((ulong)&local_4b0,(char)local_470);
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          uVar31 = __str_14.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < local_4a8 + __str_14._M_string_length) {
          uVar36 = 0xf;
          if (local_4b0 != &local_4a0) {
            uVar36 = local_4a0;
          }
          if (uVar36 < local_4a8 + __str_14._M_string_length) goto LAB_002474f2;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_4b0,0,(char *)0x0,(ulong)__str_14._M_dataplus._M_p);
        }
        else {
LAB_002474f2:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&__str_14,(ulong)local_4b0);
        }
        off = (size_t)&local_5a8;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_5a8._M_allocated_capacity = *puVar21;
          local_5a8._8_8_ = puVar16[3];
        }
        else {
          local_5a8._M_allocated_capacity = *puVar21;
          off = (size_t)*puVar16;
        }
        local_5b0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)puVar21 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&off);
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_2._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_2,(ulong)closeLoopString._M_dataplus._M_p);
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620.field_2._8_8_ = plVar15[3];
          local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        }
        else {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_620._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::operator=((string *)&closeLoopString,(string *)&local_620);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_5a8) {
          operator_delete((void *)off);
        }
        if (local_4b0 != &local_4a0) {
          operator_delete(local_4b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        sVar17 = local_60;
        if (local_490 != &local_480) {
          operator_delete(local_490);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
      }
      genDependentAggLoopString
                (&local_620,this,local_420,sVar17,local_468,local_f8,maxDepth,&productString);
      std::__cxx11::string::_M_append((char *)&loopString,(ulong)local_620._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_620._M_dataplus._M_p != &local_620.field_2) {
        operator_delete(local_620._M_dataplus._M_p);
      }
      std::operator+(&__str_2,&productString,&loopString);
      plVar15 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&__str_2,(ulong)closeLoopString._M_dataplus._M_p);
      local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
      psVar22 = (size_type *)(plVar15 + 2);
      if ((size_type *)*plVar15 == psVar22) {
        local_620.field_2._M_allocated_capacity = *psVar22;
        local_620.field_2._8_8_ = plVar15[3];
      }
      else {
        local_620.field_2._M_allocated_capacity = *psVar22;
        local_620._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_620._M_string_length = plVar15[1];
      *plVar15 = (long)psVar22;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_620._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_620._M_dataplus._M_p != &local_620.field_2) {
        operator_delete(local_620._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      pvVar6 = (this->newAggregateRegister).
               super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar27 = pvVar6[sVar17].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl
                .super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar6[sVar17].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                   _M_impl.super__Vector_impl_data + 8) != pAVar27) {
        uVar36 = 0;
        do {
          if (pAVar27[uVar36].postLoopAgg == true) {
            __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
            std::__cxx11::string::_M_construct((ulong)&__str_14,(char)local_470);
            puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&__str_14);
            puVar21 = puVar16 + 2;
            if ((ulong *)*puVar16 == puVar21) {
              local_5a8._M_allocated_capacity = *puVar21;
              local_5a8._8_8_ = puVar16[3];
              off = (size_t)&local_5a8;
            }
            else {
              local_5a8._M_allocated_capacity = *puVar21;
              off = (size_t)*puVar16;
            }
            local_5b0 = puVar16[1];
            *puVar16 = puVar21;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            uVar28 = this->aggregateCounter;
            cVar29 = '\x01';
            if (9 < uVar28) {
              uVar35 = uVar28;
              cVar30 = '\x04';
              do {
                cVar29 = cVar30;
                if (uVar35 < 100) {
                  cVar29 = cVar29 + -2;
                  goto LAB_002482fa;
                }
                if (uVar35 < 1000) {
                  cVar29 = cVar29 + -1;
                  goto LAB_002482fa;
                }
                if (uVar35 < 10000) goto LAB_002482fa;
                bVar13 = 99999 < uVar35;
                uVar35 = uVar35 / 10000;
                cVar30 = cVar29 + '\x04';
              } while (bVar13);
              cVar29 = cVar29 + '\x01';
            }
LAB_002482fa:
            __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
            std::__cxx11::string::_M_construct((ulong)&__str_1,cVar29);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar28);
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)off != &local_5a8) {
              uVar31 = local_5a8._M_allocated_capacity;
            }
            if ((ulong)uVar31 < __str_1._M_string_length + local_5b0) {
              uVar31 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
                uVar31 = __str_1.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar31 < __str_1._M_string_length + local_5b0) goto LAB_0024838b;
              puVar16 = (undefined8 *)
                        std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,off);
            }
            else {
LAB_0024838b:
              puVar16 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&off,(ulong)__str_1._M_dataplus._M_p);
            }
            __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
            psVar22 = puVar16 + 2;
            if ((size_type *)*puVar16 == psVar22) {
              __str_2.field_2._M_allocated_capacity = *psVar22;
              __str_2.field_2._8_8_ = puVar16[3];
            }
            else {
              __str_2.field_2._M_allocated_capacity = *psVar22;
              __str_2._M_dataplus._M_p = (pointer)*puVar16;
            }
            __str_2._M_string_length = puVar16[1];
            *puVar16 = psVar22;
            puVar16[1] = 0;
            *(char *)psVar22 = '\0';
            plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
            local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
            psVar22 = (size_type *)(plVar15 + 2);
            if ((size_type *)*plVar15 == psVar22) {
              local_620.field_2._M_allocated_capacity = *psVar22;
              local_620.field_2._8_8_ = plVar15[3];
            }
            else {
              local_620.field_2._M_allocated_capacity = *psVar22;
              local_620._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_620._M_string_length = plVar15[1];
            *plVar15 = (long)psVar22;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_620._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != &local_620.field_2) {
              operator_delete(local_620._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              operator_delete(__str_2._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
              operator_delete(__str_1._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)off != &local_5a8) {
              operator_delete((void *)off);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
              operator_delete(__str_14._M_dataplus._M_p);
            }
            pAVar27 = pAVar27 + uVar36;
            if ((pAVar27->previous).first <
                (ulong)(((long)(this->depListOfLoops).
                               super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->depListOfLoops).
                               super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97))
            {
              uVar28 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_468].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                           (pAVar27->previous).first * 0x18) +
                                 (pAVar27->previous).second * 8);
              cVar29 = '\x01';
              if (9 < uVar28) {
                uVar35 = uVar28;
                cVar30 = '\x04';
                do {
                  cVar29 = cVar30;
                  if (uVar35 < 100) {
                    cVar29 = cVar29 + -2;
                    goto LAB_00248588;
                  }
                  if (uVar35 < 1000) {
                    cVar29 = cVar29 + -1;
                    goto LAB_00248588;
                  }
                  if (uVar35 < 10000) goto LAB_00248588;
                  bVar13 = 99999 < uVar35;
                  uVar35 = uVar35 / 10000;
                  cVar30 = cVar29 + '\x04';
                } while (bVar13);
                cVar29 = cVar29 + '\x01';
              }
LAB_00248588:
              local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_620,cVar29);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_620._M_dataplus._M_p,(uint)local_620._M_string_length,uVar28);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &off,"aggregateRegister[",&local_620);
              plVar15 = (long *)std::__cxx11::string::append((char *)&off);
              __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
              psVar22 = (size_type *)(plVar15 + 2);
              if ((size_type *)*plVar15 == psVar22) {
                __str_2.field_2._M_allocated_capacity = *psVar22;
                __str_2.field_2._8_8_ = plVar15[3];
              }
              else {
                __str_2.field_2._M_allocated_capacity = *psVar22;
                __str_2._M_dataplus._M_p = (pointer)*plVar15;
              }
              __str_2._M_string_length = plVar15[1];
              *plVar15 = (long)psVar22;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)__str_2._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
                operator_delete(__str_2._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)off != &local_5a8) {
                operator_delete((void *)off);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_620._M_dataplus._M_p != &local_620.field_2) {
                operator_delete(local_620._M_dataplus._M_p);
              }
            }
            if ((pAVar27->postLoop).first <
                (ulong)(((long)(this->depListOfLoops).
                               super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->depListOfLoops).
                               super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97))
            {
              uVar28 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                            
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_468].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                           (pAVar27->postLoop).first * 0x18) +
                                 (pAVar27->postLoop).second * 8);
              cVar29 = '\x01';
              if (9 < uVar28) {
                uVar35 = uVar28;
                cVar30 = '\x04';
                do {
                  cVar29 = cVar30;
                  if (uVar35 < 100) {
                    cVar29 = cVar29 + -2;
                    goto LAB_0024872f;
                  }
                  if (uVar35 < 1000) {
                    cVar29 = cVar29 + -1;
                    goto LAB_0024872f;
                  }
                  if (uVar35 < 10000) goto LAB_0024872f;
                  bVar13 = 99999 < uVar35;
                  uVar35 = uVar35 / 10000;
                  cVar30 = cVar29 + '\x04';
                } while (bVar13);
                cVar29 = cVar29 + '\x01';
              }
LAB_0024872f:
              local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_620,cVar29);
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_620._M_dataplus._M_p,(uint)local_620._M_string_length,uVar28);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &off,"aggregateRegister[",&local_620);
              plVar15 = (long *)std::__cxx11::string::append((char *)&off);
              psVar22 = (size_type *)(plVar15 + 2);
              if ((size_type *)*plVar15 == psVar22) {
                __str_2.field_2._M_allocated_capacity = *psVar22;
                __str_2.field_2._8_8_ = plVar15[3];
                __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
              }
              else {
                __str_2.field_2._M_allocated_capacity = *psVar22;
                __str_2._M_dataplus._M_p = (pointer)*plVar15;
              }
              __str_2._M_string_length = plVar15[1];
              *plVar15 = (long)psVar22;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)__str_2._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
                operator_delete(__str_2._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)off != &local_5a8) {
                operator_delete((void *)off);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_620._M_dataplus._M_p != &local_620.field_2) {
                operator_delete(local_620._M_dataplus._M_p);
              }
            }
            std::__cxx11::string::pop_back();
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            *(size_t *)
             (*(long *)&(this->depAggregateRemapping).
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[sVar17].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + uVar36 * 8) = this->aggregateCounter;
            this->aggregateCounter = this->aggregateCounter + 1;
          }
          uVar36 = uVar36 + 1;
          pvVar6 = (this->newAggregateRegister).
                   super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar27 = pvVar6[sVar17].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar36 < (ulong)(((long)*(pointer *)
                                          ((long)&pvVar6[sVar17].
                                                  super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)pAVar27 >> 4) * 0x6db6db6db6db6db7));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
        operator_delete(closeLoopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)loopString._M_dataplus._M_p != &loopString.field_2) {
        operator_delete(loopString._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)productString._M_dataplus._M_p != &productString.field_2) {
        operator_delete(productString._M_dataplus._M_p);
      }
      if ((char)local_100 == '\0') break;
      local_e8 = local_e8 + 1;
      lVar26 = *(long *)((long)local_150 + 0x18);
    } while (local_e8 < (ulong)(*(long *)((long)local_150 + 0x20) - lVar26 >> 3));
  }
  pvVar6 = (this->newAggregateRegister).
           super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f8 = (dyn_bitset *)this->aggregateCounter;
  pAVar27 = pvVar6[currentLoop].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar6[currentLoop].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
               _M_impl.super__Vector_impl_data + 8) != pAVar27) {
    local_470 = (local_218 + local_468) * 3 + 9;
    uVar36 = 0;
    do {
      if ((pAVar27[uVar36].postLoopAgg == false) &&
         (pAVar27 = pAVar27 + uVar36, pAVar27->preLoopAgg == false)) {
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_620,(char)local_470);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_620);
        closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          closeLoopString.field_2._M_allocated_capacity = *psVar22;
          closeLoopString.field_2._8_8_ = plVar15[3];
        }
        else {
          closeLoopString.field_2._M_allocated_capacity = *psVar22;
          closeLoopString._M_dataplus._M_p = (pointer)*plVar15;
        }
        closeLoopString._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        uVar28 = this->aggregateCounter;
        cVar29 = '\x01';
        if (9 < uVar28) {
          uVar35 = uVar28;
          cVar30 = '\x04';
          do {
            cVar29 = cVar30;
            if (uVar35 < 100) {
              cVar29 = cVar29 + -2;
              goto LAB_00248a76;
            }
            if (uVar35 < 1000) {
              cVar29 = cVar29 + -1;
              goto LAB_00248a76;
            }
            if (uVar35 < 10000) goto LAB_00248a76;
            bVar13 = 99999 < uVar35;
            uVar35 = uVar35 / 10000;
            cVar30 = cVar29 + '\x04';
          } while (bVar13);
          cVar29 = cVar29 + '\x01';
        }
LAB_00248a76:
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str_2,cVar29);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar28);
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          uVar31 = closeLoopString.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < __str_2._M_string_length + closeLoopString._M_string_length) {
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            uVar31 = __str_2.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < __str_2._M_string_length + closeLoopString._M_string_length)
          goto LAB_00248aeb;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&__str_2,0,(char *)0x0,(ulong)closeLoopString._M_dataplus._M_p
                              );
        }
        else {
LAB_00248aeb:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&closeLoopString,(ulong)__str_2._M_dataplus._M_p);
        }
        psVar22 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar22) {
          loopString.field_2._M_allocated_capacity = *psVar22;
          loopString.field_2._8_8_ = puVar16[3];
          loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar22;
          loopString._M_dataplus._M_p = (pointer)*puVar16;
        }
        loopString._M_string_length = puVar16[1];
        *puVar16 = psVar22;
        puVar16[1] = 0;
        *(char *)psVar22 = '\0';
        plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          productString.field_2._M_allocated_capacity = *psVar22;
          productString.field_2._8_8_ = plVar15[3];
        }
        else {
          productString.field_2._M_allocated_capacity = *psVar22;
          productString._M_dataplus._M_p = (pointer)*plVar15;
        }
        productString._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
          operator_delete(closeLoopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        if ((pAVar27->previous).first <
            (ulong)(((long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97)) {
          uVar28 = *(ulong *)(*(long *)&(this->depAggregateRemapping).
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [(pAVar27->previous).first].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data +
                             (pAVar27->previous).second * 8);
          cVar29 = '\x01';
          if (9 < uVar28) {
            uVar35 = uVar28;
            cVar30 = '\x04';
            do {
              cVar29 = cVar30;
              if (uVar35 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_00248ce5;
              }
              if (uVar35 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_00248ce5;
              }
              if (uVar35 < 10000) goto LAB_00248ce5;
              bVar13 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar30 = cVar29 + '\x04';
            } while (bVar13);
            cVar29 = cVar29 + '\x01';
          }
LAB_00248ce5:
          productString._M_dataplus._M_p = (pointer)&productString.field_2;
          std::__cxx11::string::_M_construct((ulong)&productString,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar28);
          std::operator+(&closeLoopString,"aggregateRegister[",&productString);
          plVar15 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString.field_2._8_8_ = plVar15[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString._M_dataplus._M_p = (pointer)*plVar15;
          }
          loopString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
        }
        if ((pAVar27->product).first == true) {
          uVar28 = *(ulong *)(*(long *)&(this->depLocalProductRemapping).
                                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data +
                             (pAVar27->product).second * 8);
          cVar29 = '\x01';
          if (9 < uVar28) {
            uVar35 = uVar28;
            cVar30 = '\x04';
            do {
              cVar29 = cVar30;
              if (uVar35 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_00248e7a;
              }
              if (uVar35 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_00248e7a;
              }
              if (uVar35 < 10000) goto LAB_00248e7a;
              bVar13 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar30 = cVar29 + '\x04';
            } while (bVar13);
            cVar29 = cVar29 + '\x01';
          }
LAB_00248e7a:
          productString._M_dataplus._M_p = (pointer)&productString.field_2;
          std::__cxx11::string::_M_construct((ulong)&productString,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar28);
          std::operator+(&closeLoopString,"localRegister[",&productString);
          plVar15 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString.field_2._8_8_ = plVar15[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString._M_dataplus._M_p = (pointer)*plVar15;
          }
          loopString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
        }
        if (pAVar27->singleViewAgg == true) {
          std::operator+(&local_620,"aggregates_",this->viewName + (pAVar27->viewAgg).first);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_620);
          closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            closeLoopString.field_2._M_allocated_capacity = *psVar22;
            closeLoopString.field_2._8_8_ = plVar15[3];
          }
          else {
            closeLoopString.field_2._M_allocated_capacity = *psVar22;
            closeLoopString._M_dataplus._M_p = (pointer)*plVar15;
          }
          closeLoopString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          uVar28 = (pAVar27->viewAgg).second;
          cVar29 = '\x01';
          if (9 < uVar28) {
            uVar35 = uVar28;
            cVar30 = '\x04';
            do {
              cVar29 = cVar30;
              if (uVar35 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_00249074;
              }
              if (uVar35 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_00249074;
              }
              if (uVar35 < 10000) goto LAB_00249074;
              bVar13 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar30 = cVar29 + '\x04';
            } while (bVar13);
            cVar29 = cVar29 + '\x01';
          }
LAB_00249074:
          __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str_2,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar28);
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            uVar31 = closeLoopString.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < __str_2._M_string_length + closeLoopString._M_string_length) {
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              uVar31 = __str_2.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar31 < __str_2._M_string_length + closeLoopString._M_string_length)
            goto LAB_002490e9;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&__str_2,0,(char *)0x0,
                                 (ulong)closeLoopString._M_dataplus._M_p);
          }
          else {
LAB_002490e9:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&closeLoopString,(ulong)__str_2._M_dataplus._M_p);
          }
          psVar22 = puVar16 + 2;
          if ((size_type *)*puVar16 == psVar22) {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString.field_2._8_8_ = puVar16[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString._M_dataplus._M_p = (pointer)*puVar16;
          }
          loopString._M_string_length = puVar16[1];
          *puVar16 = psVar22;
          puVar16[1] = 0;
          *(char *)psVar22 = '\0';
          plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
          productString._M_dataplus._M_p = (pointer)&productString.field_2;
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            productString.field_2._M_allocated_capacity = *psVar22;
            productString.field_2._8_8_ = plVar15[3];
          }
          else {
            productString.field_2._M_allocated_capacity = *psVar22;
            productString._M_dataplus._M_p = (pointer)*plVar15;
          }
          productString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            operator_delete(__str_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_620._M_dataplus._M_p != &local_620.field_2) {
            operator_delete(local_620._M_dataplus._M_p);
          }
        }
        if ((pAVar27->postLoop).first <
            (ulong)(((long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(this->depListOfLoops).
                           super__Vector_base<DependentLoop,_std::allocator<DependentLoop>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97)) {
          uVar28 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_468].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                       (pAVar27->postLoop).first * 0x18) +
                             (pAVar27->postLoop).second * 8);
          cVar29 = '\x01';
          if (9 < uVar28) {
            uVar35 = uVar28;
            cVar30 = '\x04';
            do {
              cVar29 = cVar30;
              if (uVar35 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_00249305;
              }
              if (uVar35 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_00249305;
              }
              if (uVar35 < 10000) goto LAB_00249305;
              bVar13 = 99999 < uVar35;
              uVar35 = uVar35 / 10000;
              cVar30 = cVar29 + '\x04';
            } while (bVar13);
            cVar29 = cVar29 + '\x01';
          }
LAB_00249305:
          productString._M_dataplus._M_p = (pointer)&productString.field_2;
          std::__cxx11::string::_M_construct((ulong)&productString,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (productString._M_dataplus._M_p,(uint)productString._M_string_length,uVar28);
          std::operator+(&closeLoopString,"aggregateRegister[",&productString);
          plVar15 = (long *)std::__cxx11::string::append((char *)&closeLoopString);
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString.field_2._8_8_ = plVar15[3];
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString._M_dataplus._M_p = (pointer)*plVar15;
          }
          loopString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)loopString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
            operator_delete(closeLoopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::pop_back();
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        *(size_t *)
         (*(long *)&(this->depAggregateRemapping).
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[currentLoop].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + uVar36 * 8) = this->aggregateCounter;
        this->aggregateCounter = this->aggregateCounter + 1;
      }
      uVar36 = uVar36 + 1;
      pvVar6 = (this->newAggregateRegister).
               super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar27 = pvVar6[currentLoop].super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar36 < (ulong)(((long)*(pointer *)
                                      ((long)&pvVar6[currentLoop].
                                              super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>
                                              ._M_impl.super__Vector_impl_data + 8) - (long)pAVar27
                              >> 4) * 0x6db6db6db6db6db7));
  }
  __val = local_f8;
  if (this->aggregateCounter <= local_f8) goto LAB_00249930;
  cVar29 = (char)local_218 + '\x02' + (char)local_468;
  if (local_218 == 0) {
    cVar29 = (char)local_468 + '\x03';
  }
  off = (size_t)&local_5a8;
  std::__cxx11::string::_M_construct((ulong)&off,cVar29 * '\x03');
  plVar15 = (long *)std::__cxx11::string::append((char *)&off);
  paVar1 = &__str_2.field_2;
  psVar22 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar22) {
    __str_2.field_2._M_allocated_capacity = *psVar22;
    __str_2.field_2._8_8_ = plVar15[3];
    __str_2._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    __str_2.field_2._M_allocated_capacity = *psVar22;
    __str_2._M_dataplus._M_p = (pointer)*plVar15;
  }
  __str_2._M_string_length = plVar15[1];
  *plVar15 = (long)psVar22;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  cVar29 = '\x01';
  if (9 < __val) {
    pdVar25 = __val;
    cVar30 = '\x04';
    do {
      cVar29 = cVar30;
      if (pdVar25 < 100) {
        cVar29 = cVar29 + -2;
        goto LAB_00249585;
      }
      if (pdVar25 < 1000) {
        cVar29 = cVar29 + -1;
        goto LAB_00249585;
      }
      if (pdVar25 < 10000) goto LAB_00249585;
      bVar13 = 99999 < pdVar25;
      pdVar25 = (dyn_bitset *)((ulong)pdVar25 / 10000);
      cVar30 = cVar29 + '\x04';
    } while (bVar13);
    cVar29 = cVar29 + '\x01';
  }
LAB_00249585:
  paVar3 = &__str_14.field_2;
  __str_14._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&__str_14,cVar29);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_14._M_dataplus._M_p,(uint)__str_14._M_string_length,(unsigned_long)__val);
  uVar31 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    uVar31 = __str_2.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar31 < __str_14._M_string_length + __str_2._M_string_length) {
    uVar31 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_14._M_dataplus._M_p != paVar3) {
      uVar31 = __str_14.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar31 < __str_14._M_string_length + __str_2._M_string_length) goto LAB_002495ff;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&__str_14,0,(char *)0x0,(ulong)__str_2._M_dataplus._M_p);
  }
  else {
LAB_002495ff:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&__str_2,(ulong)__str_14._M_dataplus._M_p);
  }
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  psVar22 = puVar16 + 2;
  if ((size_type *)*puVar16 == psVar22) {
    local_620.field_2._M_allocated_capacity = *psVar22;
    local_620.field_2._8_8_ = puVar16[3];
  }
  else {
    local_620.field_2._M_allocated_capacity = *psVar22;
    local_620._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_620._M_string_length = puVar16[1];
  *puVar16 = psVar22;
  puVar16[1] = 0;
  *(char *)psVar22 = '\0';
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_620);
  paVar2 = &closeLoopString.field_2;
  psVar22 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar22) {
    closeLoopString.field_2._M_allocated_capacity = *psVar22;
    closeLoopString.field_2._8_8_ = plVar15[3];
    closeLoopString._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    closeLoopString.field_2._M_allocated_capacity = *psVar22;
    closeLoopString._M_dataplus._M_p = (pointer)*plVar15;
  }
  closeLoopString._M_string_length = plVar15[1];
  *plVar15 = (long)psVar22;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  uVar36 = this->aggregateCounter - (long)__val;
  cVar29 = '\x01';
  if (9 < uVar36) {
    uVar28 = uVar36;
    cVar30 = '\x04';
    do {
      cVar29 = cVar30;
      if (uVar28 < 100) {
        cVar29 = cVar29 + -2;
        goto LAB_0024972b;
      }
      if (uVar28 < 1000) {
        cVar29 = cVar29 + -1;
        goto LAB_0024972b;
      }
      if (uVar28 < 10000) goto LAB_0024972b;
      bVar13 = 99999 < uVar28;
      uVar28 = uVar28 / 10000;
      cVar30 = cVar29 + '\x04';
    } while (bVar13);
    cVar29 = cVar29 + '\x01';
  }
LAB_0024972b:
  paVar4 = &__str_1.field_2;
  __str_1._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct((ulong)&__str_1,cVar29);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar36);
  uVar31 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)closeLoopString._M_dataplus._M_p != paVar2) {
    uVar31 = closeLoopString.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar31 < __str_1._M_string_length + closeLoopString._M_string_length) {
    uVar31 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1._M_dataplus._M_p != paVar4) {
      uVar31 = __str_1.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar31 < __str_1._M_string_length + closeLoopString._M_string_length)
    goto LAB_002497a5;
    puVar16 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&__str_1,0,(char *)0x0,(ulong)closeLoopString._M_dataplus._M_p);
  }
  else {
LAB_002497a5:
    puVar16 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&closeLoopString,(ulong)__str_1._M_dataplus._M_p);
  }
  loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
  psVar22 = puVar16 + 2;
  if ((size_type *)*puVar16 == psVar22) {
    loopString.field_2._M_allocated_capacity = *psVar22;
    loopString.field_2._8_8_ = puVar16[3];
  }
  else {
    loopString.field_2._M_allocated_capacity = *psVar22;
    loopString._M_dataplus._M_p = (pointer)*puVar16;
  }
  loopString._M_string_length = puVar16[1];
  *puVar16 = psVar22;
  puVar16[1] = 0;
  *(char *)psVar22 = '\0';
  plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
  psVar22 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar22) {
    productString.field_2._M_allocated_capacity = *psVar22;
    productString.field_2._8_8_ = plVar15[3];
    productString._M_dataplus._M_p = (pointer)&productString.field_2;
  }
  else {
    productString.field_2._M_allocated_capacity = *psVar22;
    productString._M_dataplus._M_p = (pointer)*plVar15;
  }
  productString._M_string_length = plVar15[1];
  *plVar15 = (long)psVar22;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::string::_M_append((char *)resetString,(ulong)productString._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)productString._M_dataplus._M_p != &productString.field_2) {
    operator_delete(productString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)loopString._M_dataplus._M_p != &loopString.field_2) {
    operator_delete(loopString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != paVar4) {
    operator_delete(__str_1._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)closeLoopString._M_dataplus._M_p != paVar2) {
    operator_delete(closeLoopString._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_14._M_dataplus._M_p != paVar3) {
    operator_delete(__str_14._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_2._M_dataplus._M_p != paVar1) {
    operator_delete(__str_2._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)off != &local_5a8) {
    operator_delete((void *)off);
  }
LAB_00249930:
  local_150 = (pointer)((long)local_150 + 0x30);
  outViewID = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,
                         0);
  if (outViewID != 0xffffffffffffffff) {
    local_218 = local_218 + local_468;
    local_468 = local_468 + 1;
    do {
      pVVar18 = QueryCompiler::getView
                          ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,outViewID);
      closeLoopString._M_dataplus._M_p = (pointer)&closeLoopString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&closeLoopString,"");
      uVar36 = 0;
      do {
        uVar35 = uVar36 >> 6;
        uVar28 = 1L << ((byte)uVar36 & 0x3f);
        if (((pVVar18->_fVars).super__Base_bitset<2UL>._M_w[uVar35] >> (uVar36 & 0x3f) & 1) != 0) {
          if (((local_420->_bag).super__Base_bitset<2UL>._M_w[uVar35] & uVar28) == 0) {
            psVar9 = this->incomingViews[outViewID].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (psVar34 = this->incomingViews[outViewID].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; psVar34 != psVar9;
                psVar34 = psVar34 + 1) {
              pVVar20 = QueryCompiler::getView
                                  ((this->_qc).
                                   super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,*psVar34);
              if (((pVVar20->_fVars).super__Base_bitset<2UL>._M_w[uVar35] & uVar28) != 0) {
                local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
                pcVar8 = this->viewName[*psVar34]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_620,pcVar8,
                           pcVar8 + this->viewName[*psVar34]._M_string_length);
                std::__cxx11::string::append((char *)&local_620);
                pAVar19 = TreeDecomposition::getAttribute
                                    ((this->_td).
                                     super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,uVar36);
                plVar15 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_620,
                                             (ulong)(pAVar19->_name)._M_dataplus._M_p);
                psVar22 = (size_type *)(plVar15 + 2);
                if ((size_type *)*plVar15 == psVar22) {
                  loopString.field_2._M_allocated_capacity = *psVar22;
                  loopString.field_2._8_8_ = plVar15[3];
                  loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
                }
                else {
                  loopString.field_2._M_allocated_capacity = *psVar22;
                  loopString._M_dataplus._M_p = (pointer)*plVar15;
                }
                loopString._M_string_length = plVar15[1];
                *plVar15 = (long)psVar22;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
                psVar22 = (size_type *)(plVar15 + 2);
                if ((size_type *)*plVar15 == psVar22) {
                  productString.field_2._M_allocated_capacity = *psVar22;
                  productString.field_2._8_8_ = plVar15[3];
                  productString._M_dataplus._M_p = (pointer)&productString.field_2;
                }
                else {
                  productString.field_2._M_allocated_capacity = *psVar22;
                  productString._M_dataplus._M_p = (pointer)*plVar15;
                }
                productString._M_string_length = plVar15[1];
                *plVar15 = (long)psVar22;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&closeLoopString,(ulong)productString._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)productString._M_dataplus._M_p != &productString.field_2) {
                  operator_delete(productString._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)loopString._M_dataplus._M_p != &loopString.field_2) {
                  operator_delete(loopString._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_620._M_dataplus._M_p != &local_620.field_2) goto LAB_00249b86;
                break;
              }
            }
          }
          else {
            local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
            pcVar8 = (local_420->_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_620,pcVar8,pcVar8 + (local_420->_name)._M_string_length);
            std::__cxx11::string::append((char *)&local_620);
            pAVar19 = TreeDecomposition::getAttribute
                                ((this->_td).
                                 super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,uVar36);
            plVar15 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_620,(ulong)(pAVar19->_name)._M_dataplus._M_p
                                        );
            psVar22 = (size_type *)(plVar15 + 2);
            if ((size_type *)*plVar15 == psVar22) {
              loopString.field_2._M_allocated_capacity = *psVar22;
              loopString.field_2._8_8_ = plVar15[3];
              loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
            }
            else {
              loopString.field_2._M_allocated_capacity = *psVar22;
              loopString._M_dataplus._M_p = (pointer)*plVar15;
            }
            loopString._M_string_length = plVar15[1];
            *plVar15 = (long)psVar22;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
            psVar22 = (size_type *)(plVar15 + 2);
            if ((size_type *)*plVar15 == psVar22) {
              productString.field_2._M_allocated_capacity = *psVar22;
              productString.field_2._8_8_ = plVar15[3];
              productString._M_dataplus._M_p = (pointer)&productString.field_2;
            }
            else {
              productString.field_2._M_allocated_capacity = *psVar22;
              productString._M_dataplus._M_p = (pointer)*plVar15;
            }
            productString._M_string_length = plVar15[1];
            *plVar15 = (long)psVar22;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&closeLoopString,(ulong)productString._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)productString._M_dataplus._M_p != &productString.field_2) {
              operator_delete(productString._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopString._M_dataplus._M_p != &loopString.field_2) {
              operator_delete(loopString._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != &local_620.field_2) {
LAB_00249b86:
              operator_delete(local_620._M_dataplus._M_p);
            }
          }
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 != 100);
      std::__cxx11::string::pop_back();
      sVar17 = outViewID;
      stringOffset = local_218 + 3 + (ulong)(local_468 < maxDepth);
      cVar29 = (char)stringOffset * '\x03';
      if (this->_requireHashing[outViewID] == false) {
        local_3f8 = &local_3e8;
        std::__cxx11::string::_M_construct((ulong)&local_3f8,cVar29);
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3f8,(ulong)this->viewName[outViewID]._M_dataplus._M_p);
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_4a0 = *puVar21;
          lStack_498 = puVar16[3];
          local_4b0 = &local_4a0;
        }
        else {
          local_4a0 = *puVar21;
          local_4b0 = (ulong *)*puVar16;
        }
        local_4a8 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_4b0);
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_450 = *puVar21;
          lStack_448 = puVar16[3];
          local_460 = &local_450;
        }
        else {
          local_450 = *puVar21;
          local_460 = (ulong *)*puVar16;
        }
        local_458 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_460,(ulong)closeLoopString._M_dataplus._M_p);
        local_490 = &local_480;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_480 = *plVar15;
          lStack_478 = puVar16[3];
        }
        else {
          local_480 = *plVar15;
          local_490 = (long *)*puVar16;
        }
        local_488 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_490);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_1._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        local_418 = &local_408;
        std::__cxx11::string::_M_construct((ulong)&local_418,cVar29);
        uVar31 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          uVar31 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar31 < local_410 + __str_1._M_string_length) {
          uVar36 = 0xf;
          if (local_418 != &local_408) {
            uVar36 = local_408;
          }
          if (uVar36 < local_410 + __str_1._M_string_length) goto LAB_0024a24c;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_418,0,(char *)0x0,(ulong)__str_1._M_dataplus._M_p);
        }
        else {
LAB_0024a24c:
          puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&__str_1,(ulong)local_418)
          ;
        }
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar22 = puVar16 + 2;
        if ((size_type *)*puVar16 == psVar22) {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14.field_2._8_8_ = puVar16[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14._M_dataplus._M_p = (pointer)*puVar16;
        }
        __str_14._M_string_length = puVar16[1];
        *puVar16 = psVar22;
        puVar16[1] = 0;
        *(char *)psVar22 = '\0';
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&__str_14);
        off = (size_t)&local_5a8;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_5a8._M_allocated_capacity = *puVar21;
          local_5a8._8_8_ = puVar16[3];
        }
        else {
          local_5a8._M_allocated_capacity = *puVar21;
          off = (size_t)*puVar16;
        }
        local_5b0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&off,(ulong)this->viewName[outViewID]._M_dataplus._M_p)
        ;
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_2._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620.field_2._8_8_ = plVar15[3];
        }
        else {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_620._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_620,
                                     (ulong)this->viewName[outViewID]._M_dataplus._M_p);
        loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          loopString.field_2._M_allocated_capacity = *psVar22;
          loopString.field_2._8_8_ = plVar15[3];
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar22;
          loopString._M_dataplus._M_p = (pointer)*plVar15;
        }
        loopString._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          productString.field_2._M_allocated_capacity = *psVar22;
          productString.field_2._8_8_ = plVar15[3];
        }
        else {
          productString.field_2._M_allocated_capacity = *psVar22;
          productString._M_dataplus._M_p = (pointer)*plVar15;
        }
        productString._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_5a8) {
          operator_delete((void *)off);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if (local_418 != &local_408) {
          operator_delete(local_418);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_490 != &local_480) {
          operator_delete(local_490);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_4b0 != &local_4a0) {
          operator_delete(local_4b0);
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8);
        }
      }
      else {
        local_120 = &local_110;
        std::__cxx11::string::_M_construct((ulong)&local_120,cVar29);
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_120,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_238 = &local_228;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_228 = *puVar21;
          lStack_220 = puVar16[3];
        }
        else {
          local_228 = *puVar21;
          local_238 = (ulong *)*puVar16;
        }
        local_230 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
        local_210 = &local_200;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_200 = *puVar24;
          uStack_1f8 = puVar16[3];
        }
        else {
          local_200 = *puVar24;
          local_210 = (undefined8 *)*puVar16;
        }
        local_208 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_210,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_1d0 = &local_1c0;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_1c0 = *plVar15;
          lStack_1b8 = puVar16[3];
        }
        else {
          local_1c0 = *plVar15;
          local_1d0 = (long *)*puVar16;
        }
        local_1c8 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
        local_1f0 = &local_1e0;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_1e0 = *plVar15;
          lStack_1d8 = puVar16[3];
        }
        else {
          local_1e0 = *plVar15;
          local_1f0 = (long *)*puVar16;
        }
        local_1e8 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1f0,(ulong)closeLoopString._M_dataplus._M_p);
        local_1b0 = &local_1a0;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_1a0 = *plVar15;
          lStack_198 = puVar16[3];
        }
        else {
          local_1a0 = *plVar15;
          local_1b0 = (long *)*puVar16;
        }
        local_1a8 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
        local_338 = &local_328;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_328 = *puVar21;
          lStack_320 = puVar16[3];
        }
        else {
          local_328 = *puVar21;
          local_338 = (ulong *)*puVar16;
        }
        local_330 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_2b8 = &local_2a8;
        std::__cxx11::string::_M_construct((ulong)&local_2b8,cVar29);
        uVar36 = 0xf;
        if (local_338 != &local_328) {
          uVar36 = local_328;
        }
        if (uVar36 < (ulong)(local_2b0 + local_330)) {
          uVar36 = 0xf;
          if (local_2b8 != &local_2a8) {
            uVar36 = local_2a8;
          }
          if (uVar36 < (ulong)(local_2b0 + local_330)) goto LAB_0024a378;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_338);
        }
        else {
LAB_0024a378:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_2b8);
        }
        local_440 = &local_430;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_430 = *puVar21;
          uStack_428 = puVar16[3];
        }
        else {
          local_430 = *puVar21;
          local_440 = (ulong *)*puVar16;
        }
        local_438 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
        sVar17 = outViewID;
        local_318 = &local_308;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_308 = *puVar24;
          uStack_300 = puVar16[3];
        }
        else {
          local_308 = *puVar24;
          local_318 = (undefined8 *)*puVar16;
        }
        local_310 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_318,(ulong)this->viewName[outViewID]._M_dataplus._M_p);
        local_298 = &local_288;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_288 = *puVar21;
          lStack_280 = puVar16[3];
        }
        else {
          local_288 = *puVar21;
          local_298 = (ulong *)*puVar16;
        }
        local_290 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
        local_2f8 = &local_2e8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_2e8 = *puVar24;
          uStack_2e0 = puVar16[3];
        }
        else {
          local_2e8 = *puVar24;
          local_2f8 = (undefined8 *)*puVar16;
        }
        local_2f0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2f8,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_278 = &local_268;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_268 = *puVar21;
          lStack_260 = puVar16[3];
        }
        else {
          local_268 = *puVar21;
          local_278 = (ulong *)*puVar16;
        }
        local_270 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
        local_3b8 = &local_3a8;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_3a8 = *puVar21;
          uStack_3a0 = puVar16[3];
        }
        else {
          local_3a8 = *puVar21;
          local_3b8 = (ulong *)*puVar16;
        }
        local_3b0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        cVar30 = (char)stringOffset * '\x03' + '\x03';
        local_358 = &local_348;
        std::__cxx11::string::_M_construct((ulong)&local_358,cVar30);
        uVar36 = 0xf;
        if (local_3b8 != &local_3a8) {
          uVar36 = local_3a8;
        }
        if (uVar36 < (ulong)(local_350 + local_3b0)) {
          uVar36 = 0xf;
          if (local_358 != &local_348) {
            uVar36 = local_348;
          }
          if (uVar36 < (ulong)(local_350 + local_3b0)) goto LAB_0024aa74;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,(ulong)local_3b8);
        }
        else {
LAB_0024aa74:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)local_358);
        }
        local_3d8 = &local_3c8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_3c8 = *puVar24;
          uStack_3c0 = puVar16[3];
        }
        else {
          local_3c8 = *puVar24;
          local_3d8 = (undefined8 *)*puVar16;
        }
        local_3d0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)puVar24 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
        sVar17 = outViewID;
        local_190 = &local_180;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_180 = *plVar15;
          lStack_178 = puVar16[3];
        }
        else {
          local_180 = *plVar15;
          local_190 = (long *)*puVar16;
        }
        local_188 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_190,(ulong)this->viewName[outViewID]._M_dataplus._M_p);
        local_258 = &local_248;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_248 = *puVar21;
          lStack_240 = puVar16[3];
        }
        else {
          local_248 = *puVar21;
          local_258 = (ulong *)*puVar16;
        }
        local_250 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
        local_2d8 = &local_2c8;
        puVar24 = puVar16 + 2;
        if ((undefined8 *)*puVar16 == puVar24) {
          local_2c8 = *puVar24;
          uStack_2c0 = puVar16[3];
        }
        else {
          local_2c8 = *puVar24;
          local_2d8 = (undefined8 *)*puVar16;
        }
        local_2d0 = puVar16[1];
        *puVar16 = puVar24;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_2d8,(ulong)this->viewName[sVar17]._M_dataplus._M_p);
        local_418 = &local_408;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_408 = *puVar21;
          lStack_400 = puVar16[3];
        }
        else {
          local_408 = *puVar21;
          local_418 = (ulong *)*puVar16;
        }
        local_410 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_418);
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_3e8 = *puVar21;
          uStack_3e0 = puVar16[3];
          local_3f8 = &local_3e8;
        }
        else {
          local_3e8 = *puVar21;
          local_3f8 = (ulong *)*puVar16;
        }
        local_3f0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_378 = &local_368;
        std::__cxx11::string::_M_construct((ulong)&local_378,cVar29);
        uVar36 = 0xf;
        if (local_3f8 != &local_3e8) {
          uVar36 = local_3e8;
        }
        if (uVar36 < (ulong)(local_370 + local_3f0)) {
          uVar36 = 0xf;
          if (local_378 != &local_368) {
            uVar36 = local_368;
          }
          if (uVar36 < (ulong)(local_370 + local_3f0)) goto LAB_0024ad9d;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_3f8);
        }
        else {
LAB_0024ad9d:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_378);
        }
        local_4b0 = &local_4a0;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_4a0 = *puVar21;
          lStack_498 = puVar16[3];
        }
        else {
          local_4a0 = *puVar21;
          local_4b0 = (ulong *)*puVar16;
        }
        local_4a8 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)puVar21 = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_4b0);
        local_460 = &local_450;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_450 = *puVar21;
          lStack_448 = puVar16[3];
        }
        else {
          local_450 = *puVar21;
          local_460 = (ulong *)*puVar16;
        }
        local_458 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        local_140 = &local_130;
        std::__cxx11::string::_M_construct((ulong)&local_140,cVar30);
        uVar36 = 0xf;
        if (local_460 != &local_450) {
          uVar36 = local_450;
        }
        if (uVar36 < (ulong)(local_138 + local_458)) {
          uVar36 = 0xf;
          if (local_140 != &local_130) {
            uVar36 = local_130;
          }
          if (uVar36 < (ulong)(local_138 + local_458)) goto LAB_0024af11;
          puVar16 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,(ulong)local_460);
        }
        else {
LAB_0024af11:
          puVar16 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_140);
        }
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_480 = *plVar15;
          lStack_478 = puVar16[3];
          local_490 = &local_480;
        }
        else {
          local_480 = *plVar15;
          local_490 = (long *)*puVar16;
        }
        local_488 = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)plVar15 = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_490);
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_1.field_2._M_allocated_capacity = *psVar22;
          __str_1._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_1._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&__str_1,
                                     (ulong)this->viewName[outViewID]._M_dataplus._M_p);
        __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_14.field_2._M_allocated_capacity = *psVar22;
          __str_14._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_14._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&__str_14);
        off = (size_t)&local_5a8;
        puVar21 = puVar16 + 2;
        if ((ulong *)*puVar16 == puVar21) {
          local_5a8._M_allocated_capacity = *puVar21;
          local_5a8._8_8_ = puVar16[3];
        }
        else {
          local_5a8._M_allocated_capacity = *puVar21;
          off = (size_t)*puVar16;
        }
        local_5b0 = puVar16[1];
        *puVar16 = puVar21;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&off,(ulong)this->viewName[outViewID]._M_dataplus._M_p)
        ;
        __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2.field_2._8_8_ = plVar15[3];
        }
        else {
          __str_2.field_2._M_allocated_capacity = *psVar22;
          __str_2._M_dataplus._M_p = (pointer)*plVar15;
        }
        __str_2._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
        local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620.field_2._8_8_ = plVar15[3];
        }
        else {
          local_620.field_2._M_allocated_capacity = *psVar22;
          local_620._M_dataplus._M_p = (pointer)*plVar15;
        }
        local_620._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_620,(ulong)closeLoopString._M_dataplus._M_p);
        loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          loopString.field_2._M_allocated_capacity = *psVar22;
          loopString.field_2._8_8_ = plVar15[3];
        }
        else {
          loopString.field_2._M_allocated_capacity = *psVar22;
          loopString._M_dataplus._M_p = (pointer)*plVar15;
        }
        loopString._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
        productString._M_dataplus._M_p = (pointer)&productString.field_2;
        psVar22 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar22) {
          productString.field_2._M_allocated_capacity = *psVar22;
          productString.field_2._8_8_ = plVar15[3];
        }
        else {
          productString.field_2._M_allocated_capacity = *psVar22;
          productString._M_dataplus._M_p = (pointer)*plVar15;
        }
        productString._M_string_length = plVar15[1];
        *plVar15 = (long)psVar22;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)productString._M_dataplus._M_p != &productString.field_2) {
          operator_delete(productString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)loopString._M_dataplus._M_p != &loopString.field_2) {
          operator_delete(loopString._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          operator_delete(__str_2._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)off != &local_5a8) {
          operator_delete((void *)off);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
          operator_delete(__str_14._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p);
        }
        if (local_490 != &local_480) {
          operator_delete(local_490);
        }
        if (local_140 != &local_130) {
          operator_delete(local_140);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460);
        }
        if (local_4b0 != &local_4a0) {
          operator_delete(local_4b0);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378);
        }
        if (local_3f8 != &local_3e8) {
          operator_delete(local_3f8);
        }
        if (local_418 != &local_408) {
          operator_delete(local_418);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8);
        }
        if (local_258 != &local_248) {
          operator_delete(local_258);
        }
        if (local_190 != &local_180) {
          operator_delete(local_190);
        }
        if (local_3d8 != &local_3c8) {
          operator_delete(local_3d8);
        }
        if (local_358 != &local_348) {
          operator_delete(local_358);
        }
        if (local_3b8 != &local_3a8) {
          operator_delete(local_3b8);
        }
        if (local_278 != &local_268) {
          operator_delete(local_278);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8);
        }
        if (local_298 != &local_288) {
          operator_delete(local_298);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318);
        }
        if (local_440 != &local_430) {
          operator_delete(local_440);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0);
        }
        if (local_1f0 != &local_1e0) {
          operator_delete(local_1f0);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210);
        }
        if (local_238 != &local_228) {
          operator_delete(local_238);
        }
        if (local_120 != &local_110) {
          operator_delete(local_120);
        }
      }
      if (multifaq::cppgen::COMPRESS_AGGREGATES == '\x01') {
        productString._M_dataplus._M_p = (pointer)0x0;
        loopString._M_dataplus._M_p = (pointer)0x0;
        __str_2._M_dataplus._M_p = (pointer)0x0;
        mapAggregateToIndexes
                  (this,(AggregateIndexes *)&productString,
                   (this->aggregateComputation).
                   super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[outViewID].
                   super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                   super__Vector_impl_data._M_start,&outViewID,&maxDepth);
        sVar17 = outViewID;
        off = 0;
        pvVar10 = (this->aggregateComputation).
                  super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar26 = *(long *)&pvVar10[outViewID].
                           super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>.
                           _M_impl.super__Vector_impl_data;
        if (1 < (ulong)(((long)*(pointer *)
                                ((long)&pvVar10[outViewID].
                                        super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar26 >> 3) *
                       0x193d4bb7e327a977)) {
          uVar36 = 1;
          lVar37 = 0x238;
          do {
            loopString.field_2._M_allocated_capacity = 0;
            loopString.field_2._8_8_ = 0;
            loopString._M_dataplus._M_p = (pointer)0x0;
            loopString._M_string_length = 0;
            mapAggregateToIndexes
                      (this,(AggregateIndexes *)&loopString,(AggregateTuple *)(lVar26 + lVar37),
                       &outViewID,&maxDepth);
            bVar13 = AggregateIndexes::isIncrement
                               ((AggregateIndexes *)&loopString,(AggregateIndexes *)&productString,
                                &off,(bitset<7UL> *)&__str_2);
            if (bVar13) {
              off = off + 1;
            }
            else {
              outputFinalRegTupleString_abi_cxx11_
                        (&local_620,this,(AggregateIndexes *)&productString,off,
                         (bitset<7UL> *)&__str_2,stringOffset);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_620._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_620._M_dataplus._M_p != &local_620.field_2) {
                operator_delete(local_620._M_dataplus._M_p);
              }
              psVar32 = &loopString;
              psVar33 = &productString;
              for (lVar26 = 9; lVar26 != 0; lVar26 = lVar26 + -1) {
                (psVar33->_M_dataplus)._M_p = (psVar32->_M_dataplus)._M_p;
                psVar32 = (string *)((long)psVar32 + (ulong)bVar39 * -0x10 + 8);
                psVar33 = (string *)((long)psVar33 + (ulong)bVar39 * -0x10 + 8);
              }
              off = 0;
              __str_2._M_dataplus._M_p = (pointer)0x0;
            }
            uVar36 = uVar36 + 1;
            pvVar10 = (this->aggregateComputation).
                      super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar26 = *(long *)&pvVar10[sVar17].
                               super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>.
                               _M_impl.super__Vector_impl_data;
            lVar37 = lVar37 + 0x238;
          } while (uVar36 < (ulong)(((long)*(pointer *)
                                            ((long)&pvVar10[sVar17].
                                                                                                        
                                                  super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar26 >>
                                    3) * 0x193d4bb7e327a977));
        }
        outputFinalRegTupleString_abi_cxx11_
                  (&local_620,this,(AggregateIndexes *)&productString,off,(bitset<7UL> *)&__str_2,
                   stringOffset);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_620._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p);
        }
      }
      else {
        pvVar10 = (this->aggregateComputation).
                  super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar11 = *(pointer *)
                   ((long)&pvVar10[outViewID].
                           super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>.
                           _M_impl.super__Vector_impl_data + 8);
        for (pAVar38 = pvVar10[outViewID].
                       super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>._M_impl.
                       super__Vector_impl_data._M_start; pAVar38 != pAVar11; pAVar38 = pAVar38 + 1)
        {
          __str_14._M_dataplus._M_p = (pointer)&__str_14.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str_14,cVar29);
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&__str_14);
          off = (size_t)&local_5a8;
          puVar21 = puVar16 + 2;
          if ((ulong *)*puVar16 == puVar21) {
            local_5a8._M_allocated_capacity = *puVar21;
            local_5a8._8_8_ = puVar16[3];
          }
          else {
            local_5a8._M_allocated_capacity = *puVar21;
            off = (size_t)*puVar16;
          }
          local_5b0 = puVar16[1];
          *puVar16 = puVar21;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&off,
                                       (ulong)this->viewName[outViewID]._M_dataplus._M_p);
          __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            __str_2.field_2._M_allocated_capacity = *psVar22;
            __str_2.field_2._8_8_ = plVar15[3];
          }
          else {
            __str_2.field_2._M_allocated_capacity = *psVar22;
            __str_2._M_dataplus._M_p = (pointer)*plVar15;
          }
          __str_2._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
          local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            local_620.field_2._M_allocated_capacity = *psVar22;
            local_620.field_2._8_8_ = plVar15[3];
          }
          else {
            local_620.field_2._M_allocated_capacity = *psVar22;
            local_620._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_620._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          uVar36 = pAVar38->aggID;
          cVar30 = '\x01';
          if (9 < uVar36) {
            uVar28 = uVar36;
            cVar12 = '\x04';
            do {
              cVar30 = cVar12;
              if (uVar28 < 100) {
                cVar30 = cVar30 + -2;
                goto LAB_0024b9cc;
              }
              if (uVar28 < 1000) {
                cVar30 = cVar30 + -1;
                goto LAB_0024b9cc;
              }
              if (uVar28 < 10000) goto LAB_0024b9cc;
              bVar13 = 99999 < uVar28;
              uVar28 = uVar28 / 10000;
              cVar12 = cVar30 + '\x04';
            } while (bVar13);
            cVar30 = cVar30 + '\x01';
          }
LAB_0024b9cc:
          __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str_1,cVar30);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar36);
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_620._M_dataplus._M_p != &local_620.field_2) {
            uVar31 = local_620.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < __str_1._M_string_length + local_620._M_string_length) {
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
              uVar31 = __str_1.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar31 < __str_1._M_string_length + local_620._M_string_length)
            goto LAB_0024ba5f;
            puVar16 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&__str_1,0,(char *)0x0,(ulong)local_620._M_dataplus._M_p);
          }
          else {
LAB_0024ba5f:
            puVar16 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_620,(ulong)__str_1._M_dataplus._M_p);
          }
          loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
          psVar22 = puVar16 + 2;
          if ((size_type *)*puVar16 == psVar22) {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString.field_2._8_8_ = puVar16[3];
          }
          else {
            loopString.field_2._M_allocated_capacity = *psVar22;
            loopString._M_dataplus._M_p = (pointer)*puVar16;
          }
          loopString._M_string_length = puVar16[1];
          *puVar16 = psVar22;
          puVar16[1] = 0;
          *(char *)psVar22 = '\0';
          plVar15 = (long *)std::__cxx11::string::append((char *)&loopString);
          productString._M_dataplus._M_p = (pointer)&productString.field_2;
          psVar22 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar22) {
            productString.field_2._M_allocated_capacity = *psVar22;
            productString.field_2._8_8_ = plVar15[3];
          }
          else {
            productString.field_2._M_allocated_capacity = *psVar22;
            productString._M_dataplus._M_p = (pointer)*plVar15;
          }
          productString._M_string_length = plVar15[1];
          *plVar15 = (long)psVar22;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)loopString._M_dataplus._M_p != &loopString.field_2) {
            operator_delete(loopString._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
            operator_delete(__str_1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_620._M_dataplus._M_p != &local_620.field_2) {
            operator_delete(local_620._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
            operator_delete(__str_2._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)off != &local_5a8) {
            operator_delete((void *)off);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_14._M_dataplus._M_p != &__str_14.field_2) {
            operator_delete(__str_14._M_dataplus._M_p);
          }
          productString._M_dataplus._M_p = (pointer)&productString.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&productString);
          uVar36 = (pAVar38->local).first;
          if (uVar36 < maxDepth) {
            lVar26 = *(long *)&(this->productToVariableRegister).
                               super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar36].
                               super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                               ._M_impl.super__Vector_impl_data;
            lVar37 = (pAVar38->local).second * 0x100;
            uVar36 = *(ulong *)(*(long *)(*(long *)&(this->newAggregateRemapping).
                                                                                                        
                                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(pAVar38->local).first].
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                         *(long *)(lVar26 + 0xe8 + lVar37) * 0x18) +
                               *(long *)(lVar26 + 0xf0 + lVar37) * 8);
            cVar30 = '\x01';
            if (9 < uVar36) {
              uVar28 = uVar36;
              cVar12 = '\x04';
              do {
                cVar30 = cVar12;
                if (uVar28 < 100) {
                  cVar30 = cVar30 + -2;
                  goto LAB_0024bccf;
                }
                if (uVar28 < 1000) {
                  cVar30 = cVar30 + -1;
                  goto LAB_0024bccf;
                }
                if (uVar28 < 10000) goto LAB_0024bccf;
                bVar13 = 99999 < uVar28;
                uVar28 = uVar28 / 10000;
                cVar12 = cVar30 + '\x04';
              } while (bVar13);
              cVar30 = cVar30 + '\x01';
            }
LAB_0024bccf:
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
            std::__cxx11::string::_M_construct((ulong)&loopString,cVar30);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (loopString._M_dataplus._M_p,(uint)loopString._M_string_length,uVar36);
            std::operator+(&__str_2,"aggregateRegister[",&loopString);
            plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
            local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
            psVar22 = (size_type *)(plVar15 + 2);
            if ((size_type *)*plVar15 == psVar22) {
              local_620.field_2._M_allocated_capacity = *psVar22;
              local_620.field_2._8_8_ = plVar15[3];
            }
            else {
              local_620.field_2._M_allocated_capacity = *psVar22;
              local_620._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_620._M_string_length = plVar15[1];
            *plVar15 = (long)psVar22;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&productString,(ulong)local_620._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != &local_620.field_2) {
              operator_delete(local_620._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              operator_delete(__str_2._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopString._M_dataplus._M_p != &loopString.field_2) {
              operator_delete(loopString._M_dataplus._M_p);
            }
          }
          if ((pAVar38->post).first < maxDepth) {
            uVar36 = *(ulong *)(*(long *)&(this->postRemapping).
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [(pAVar38->post).first].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data +
                               (pAVar38->post).second * 8);
            cVar30 = '\x01';
            if (9 < uVar36) {
              uVar28 = uVar36;
              cVar12 = '\x04';
              do {
                cVar30 = cVar12;
                if (uVar28 < 100) {
                  cVar30 = cVar30 + -2;
                  goto LAB_0024be4c;
                }
                if (uVar28 < 1000) {
                  cVar30 = cVar30 + -1;
                  goto LAB_0024be4c;
                }
                if (uVar28 < 10000) goto LAB_0024be4c;
                bVar13 = 99999 < uVar28;
                uVar28 = uVar28 / 10000;
                cVar12 = cVar30 + '\x04';
              } while (bVar13);
              cVar30 = cVar30 + '\x01';
            }
LAB_0024be4c:
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
            std::__cxx11::string::_M_construct((ulong)&loopString,cVar30);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (loopString._M_dataplus._M_p,(uint)loopString._M_string_length,uVar36);
            std::operator+(&__str_2,"postRegister[",&loopString);
            plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
            local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
            psVar22 = (size_type *)(plVar15 + 2);
            if ((size_type *)*plVar15 == psVar22) {
              local_620.field_2._M_allocated_capacity = *psVar22;
              local_620.field_2._8_8_ = plVar15[3];
            }
            else {
              local_620.field_2._M_allocated_capacity = *psVar22;
              local_620._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_620._M_string_length = plVar15[1];
            *plVar15 = (long)psVar22;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&productString,(ulong)local_620._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != &local_620.field_2) {
              operator_delete(local_620._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              operator_delete(__str_2._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopString._M_dataplus._M_p != &loopString.field_2) {
              operator_delete(loopString._M_dataplus._M_p);
            }
          }
          if (pAVar38->hasDependentComputation == true) {
            uVar36 = *(ulong *)(*(long *)&(this->depAggregateRemapping).
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start
                                          [(pAVar38->dependentProdAgg).correspondingLoopAgg.first].
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data +
                               (pAVar38->dependentProdAgg).correspondingLoopAgg.second * 8);
            cVar30 = '\x01';
            if (9 < uVar36) {
              uVar28 = uVar36;
              cVar12 = '\x04';
              do {
                cVar30 = cVar12;
                if (uVar28 < 100) {
                  cVar30 = cVar30 + -2;
                  goto LAB_0024bfcb;
                }
                if (uVar28 < 1000) {
                  cVar30 = cVar30 + -1;
                  goto LAB_0024bfcb;
                }
                if (uVar28 < 10000) goto LAB_0024bfcb;
                bVar13 = 99999 < uVar28;
                uVar28 = uVar28 / 10000;
                cVar12 = cVar30 + '\x04';
              } while (bVar13);
              cVar30 = cVar30 + '\x01';
            }
LAB_0024bfcb:
            loopString._M_dataplus._M_p = (pointer)&loopString.field_2;
            std::__cxx11::string::_M_construct((ulong)&loopString,cVar30);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (loopString._M_dataplus._M_p,(uint)loopString._M_string_length,uVar36);
            std::operator+(&__str_2,"aggregateRegister[",&loopString);
            plVar15 = (long *)std::__cxx11::string::append((char *)&__str_2);
            local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
            psVar22 = (size_type *)(plVar15 + 2);
            if ((size_type *)*plVar15 == psVar22) {
              local_620.field_2._M_allocated_capacity = *psVar22;
              local_620.field_2._8_8_ = plVar15[3];
            }
            else {
              local_620.field_2._M_allocated_capacity = *psVar22;
              local_620._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_620._M_string_length = plVar15[1];
            *plVar15 = (long)psVar22;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&productString,(ulong)local_620._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_620._M_dataplus._M_p != &local_620.field_2) {
              operator_delete(local_620._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
              operator_delete(__str_2._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)loopString._M_dataplus._M_p != &loopString.field_2) {
              operator_delete(loopString._M_dataplus._M_p);
            }
          }
          if (productString._M_string_length == 0) {
            std::__cxx11::string::_M_replace((ulong)&productString,0,(char *)0x0,0x2b3dc7);
          }
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)productString._M_dataplus._M_p);
          std::__cxx11::string::pop_back();
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)productString._M_dataplus._M_p != &productString.field_2) {
            operator_delete(productString._M_dataplus._M_p);
          }
        }
      }
      outViewID = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             local_150,outViewID);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)closeLoopString._M_dataplus._M_p != &closeLoopString.field_2) {
        operator_delete(closeLoopString._M_dataplus._M_p);
      }
    } while (outViewID != 0xffffffffffffffff);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)depthString._M_dataplus._M_p != &depthString.field_2) {
    operator_delete(depthString._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genDependentAggLoopString(
    const TDNode& node, const size_t currentLoop,size_t depth,
    const dyn_bitset& contributingViews, const size_t maxDepth,std::string& resetString)
{
    const size_t thisLoopID = currentLoop;

    const DependentLoop& depLoop = depListOfLoops[thisLoopID];
    const dyn_bitset& thisLoop = depLoop.loopFactors;

    size_t numOfLoops = thisLoop.count();

    std::string returnString = "";

    std::string depthString = std::to_string(depth);
        
    // Print all products for this considered loop
    for (size_t prodID = 0; prodID < localProductList[thisLoopID].size(); ++prodID)
    {
        const prod_bitset& product = localProductList[thisLoopID][prodID];

        // We turn the product into a string 
        std::string productString = genProductString(node,contributingViews,product);

        returnString += offset(3+depth+numOfLoops)+"localRegister["+
            std::to_string(productCounter)+"] = "+productString+";\n";
        
        // increment the counter and update the remapping array
        depLocalProductRemapping[thisLoopID][prodID] = productCounter;
        ++productCounter;
    }

    // for (size_t viewProd = 0; viewProd < viewProductList[thisLoopID].size();
    // ++viewProd)
    // {
    //     std::string viewProduct = "";
    //     for (const std::pair<size_t, size_t>& viewAgg :
    //              viewProductList[thisLoopID][viewProd])
    //     {
    //         viewProduct += "aggregates_"+viewName[viewAgg.first]+"["+
    //             std::to_string(viewAgg.second)+"]*";
    //     }   
    //     viewProduct.pop_back();
    //     returnString += offset(3+depth+numOfLoops)+
    //         "viewRegister["+std::to_string(viewCounter)+"] = "+
    //         viewProduct +";\n";
    //     // Increment the counter and update the remapping array
    //     viewProductRemapping[thisLoopID][viewProd] = viewCounter;
    //     ++viewCounter;
    // }    
    
    for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
    {        
        const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
        if (regTuple.preLoopAgg)
        {
            // We use a mapping to the correct index
            returnString += offset(3+depth+numOfLoops)+
                "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";

            if (regTuple.previous.first < depListOfLoops.size())
            {
                std::string prev = std::to_string(
                    depAggregateRemapping[regTuple.previous.first]
                    [regTuple.previous.second]);
                
                returnString += "aggregateRegister["+prev+"]*";
            }

            if (regTuple.product.first)
            {
                std::string local = std::to_string(
                    depLocalProductRemapping[thisLoopID][regTuple.product.second]
                    );
                returnString += "localRegister["+local+"]*";
            }
            
            if (regTuple.singleViewAgg)
            {
                returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                    std::to_string(regTuple.viewAgg.second)+"]*";
            }
            
            returnString.pop_back();
            returnString += ";\n";

            // Increment the counter and update the remapping array
            depAggregateRemapping[thisLoopID][aggID] = aggregateCounter;
            ++aggregateCounter;

        }
    }

    
    // Recurse to the next loop(s) if possible
    for (size_t next=0; next < depLoop.next.size(); ++next)
    {
        size_t nextLoop = depLoop.next[next];
        DependentLoop& nextDepLoop = depListOfLoops[nextLoop];
        
        if (((nextDepLoop.loopFactors & thisLoop) == thisLoop))
        {
            size_t viewID = nextDepLoop.loopVariable;

            std::string resetAggregates = "";
            std::string loopString = "", closeLoopString = "";
            if (viewID < _qc->numberOfViews())
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+viewName[viewID]+
                    " = lowerptr_"+viewName[viewID]+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+viewName[viewID]+
                    " <= upperptr_"+viewName[viewID]+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+viewName[viewID]+
                    "_tuple &"+viewName[viewID]+"Tuple = "+viewName[viewID]+
                    "[ptr_"+viewName[viewID]+"];\n"+
                    offset(4+depth+numOfLoops)+"double *aggregates_"+viewName[viewID]+
                    " = "+viewName[viewID]+"Tuple.aggregates;\n";
                
                closeLoopString += offset(4+depth+numOfLoops)+"++ptr_"+viewName[viewID]+
                    ";\n"+offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }
            else 
            {
                loopString +=
                    offset(3+depth+numOfLoops)+"ptr_"+node._name+
                    " = lowerptr_"+node._name+"["+depthString+"];\n"+
                    offset(3+depth+numOfLoops)+"while(ptr_"+node._name+
                    " <= upperptr_"+node._name+"["+depthString+"])\n"+
                    offset(3+depth+numOfLoops)+"{\n"+
                    offset(4+depth+numOfLoops)+node._name +
                    "_tuple &"+node._name+"Tuple = "+node._name+
                    "[ptr_"+node._name+"];\n";
                
                closeLoopString = offset(4+depth+numOfLoops)+"++ptr_"+node._name+";\n"+
                    offset(3+depth+numOfLoops)+"}\n"+closeLoopString;
            }

            // std::cout<< "Call genDependentAggLoopString from 1 \n";
            loopString += genDependentAggLoopString(
                node, nextLoop, depth, contributingViews, maxDepth, resetAggregates);
            
            returnString += resetAggregates+loopString+closeLoopString;

            // After recurse, add the aggregates that have been added with post FLAG
            for (size_t aggID = 0; aggID <
                     newAggregateRegister[nextLoop].size(); ++aggID)
            {
                const AggRegTuple& regTuple = newAggregateRegister[nextLoop][aggID];
        
                if (regTuple.postLoopAgg)
                {

                    // TODO: TODO:  Make sure this is correct -- Can we use
                    // equality here?

                    // We use a mapping to the correct index
                    returnString += offset(3+depth+numOfLoops)+
                        "aggregateRegister["+std::to_string(aggregateCounter)+"] = ";
                    
                    if (regTuple.previous.first < depListOfLoops.size())
                    {
                        std::string local = std::to_string(
                            newAggregateRemapping[depth]
                            [regTuple.previous.first]
                            [regTuple.previous.second]);
                        returnString += "aggregateRegister["+local+"]*";
                    }

                    if (regTuple.postLoop.first < depListOfLoops.size())
                    {
                        std::string post = std::to_string(
                            newAggregateRemapping[depth][regTuple.postLoop.first]
                            [regTuple.postLoop.second]); 
                        returnString += "aggregateRegister["+post+"]*";
                    }
                    
                    returnString.pop_back();
                    returnString += ";\n";
            
                    // Increment the counter and update the remapping array
                    depAggregateRemapping[nextLoop][aggID] = aggregateCounter;
                    ++aggregateCounter;
                }
            }
        }
        else break;
    }


    size_t startingOffset = aggregateCounter;

    for (size_t aggID = 0; aggID < newAggregateRegister[thisLoopID].size(); ++aggID)
    {
        const AggRegTuple& regTuple = newAggregateRegister[thisLoopID][aggID];
        
        if (!regTuple.postLoopAgg && !regTuple.preLoopAgg)
        {
            // We use a mapping to the correct index
            returnString += offset(3+depth+numOfLoops)+
                "aggregateRegister["+std::to_string(aggregateCounter)+"] += ";

            if (regTuple.previous.first < depListOfLoops.size())
            {
                std::string prev = std::to_string(
                    depAggregateRemapping[regTuple.previous.first]
                    [regTuple.previous.second]);
                
                returnString += "aggregateRegister["+prev+"]*";
            }
            
            if (regTuple.product.first)
            {
                std::string local = std::to_string(
                    depLocalProductRemapping[thisLoopID][regTuple.product.second]
                    );
                returnString += "localRegister["+local+"]*";
            }
        
            if (regTuple.singleViewAgg)
            {
                returnString += "aggregates_"+viewName[regTuple.viewAgg.first]+"["+
                    std::to_string(regTuple.viewAgg.second)+"]*";
            }
            
            if (regTuple.postLoop.first < depListOfLoops.size())
            {
                std::string postLoop = std::to_string(
                    newAggregateRemapping[depth][regTuple.postLoop.first]
                    [regTuple.postLoop.second]);
                returnString += "aggregateRegister["+postLoop+"]*";
            }
            
            returnString.pop_back();
            returnString += ";\n";
            
            // Increment the counter and update the remapping array
            depAggregateRemapping[thisLoopID][aggID] = aggregateCounter;
            ++aggregateCounter;
        }
    }

    if (aggregateCounter > startingOffset)
    {
        size_t resetOffset = (numOfLoops == 0 ? 3+depth : 2+depth+numOfLoops);
        resetString += offset(resetOffset)+"memset(&aggregateRegister["+
            std::to_string(startingOffset)+"], 0, sizeof(double) * "+
            std::to_string(aggregateCounter-startingOffset)+");\n";
    }
    
    size_t outViewID = depLoop.outView.find_first();
    while (outViewID != boost::dynamic_bitset<>::npos)
    {
        View* view = _qc->getView(outViewID);
        
        // Add the code that outputs tuples for the views           
        std::string viewVars = "";            
        for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
        {
            if (view->_fVars[v])
            {
                if (node._bag[v])
                {
                    viewVars += node._name+"Tuple."+
                        _td->getAttribute(v)->_name+",";
                }
                else
                {
                    for (const size_t& incViewID : incomingViews[outViewID])
                    {
                        View* view = _qc->getView(incViewID);
                        if (view->_fVars[v])
                        {
                            viewVars += viewName[incViewID]+"Tuple."+
                                _td->getAttribute(v)->_name+",";
                            break;
                        }
                    }
                }
            }
        }
        viewVars.pop_back();

        // size_t offDepth = numOfLoops+depth+3;
        size_t offDepth = (depth + 1 < maxDepth ?
                           4+depth+numOfLoops : 3+depth+numOfLoops);
        
        if (_requireHashing[outViewID])
        {

            returnString +=
                offset(offDepth)+viewName[outViewID]+"_iterator = "+
                viewName[outViewID]+"_map.find({"+viewVars+"});\n"+
                offset(offDepth)+"if ("+viewName[outViewID]+"_iterator != "+
                viewName[outViewID]+"_map.end())\n"+
                offset(offDepth+1)+"aggregates_"+viewName[outViewID]+" = &"+
                viewName[outViewID]+"_iterator->second.aggregates[0];\n"+
                offset(offDepth)+"else\n"+
                offset(offDepth+1)+"aggregates_"+viewName[outViewID]+" = &"+
                viewName[outViewID]+"_map.insert({{"+viewVars+
                "},{}}).first->second.aggregates[0];\n";

            // This code is an alternative way to update the views that require hashing
            // returnString +=
            //     offset(offDepth)+viewName[outViewID]+"_pair = "+
            //     viewName[outViewID]+"_map.insert({{"+viewVars+"},"+
            //     viewName[outViewID]+".size()});\n"+
            //     offset(offDepth)+"if ("+viewName[outViewID]+"_pair.second)\n"+
            //     offset(offDepth)+"{\n"+
            //     offset(offDepth+1)+viewName[outViewID]+
            //     ".emplace_back("+viewVars+");\n"+
            //     offset(offDepth)+"}\n"+
            //     offset(offDepth)+"aggregates_"+viewName[outViewID]+
            //     " = "+viewName[outViewID]+"["+viewName[outViewID]+
            //     "_pair.first->second].aggregates;\n";

                // "//-----------------------------\n"+
                // offset(offDepth)+viewName[outViewID]+"_iterator"+
                // " = "+viewName[outViewID]+"_map.find({"+viewVars+"});\n"+
                // offset(offDepth)+"if ("+viewName[outViewID]+"_iterator"
                // " != "+viewName[outViewID]+"_map.end())\n"+
                // offset(offDepth)+"{\n"+
                // offset(offDepth+1)+"aggregates_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+"["+viewName[outViewID]+
                // "_iterator->second].aggregates;\n"+
                // offset(offDepth)+"}\n"+
                // offset(offDepth)+"else\n"+
                // offset(offDepth)+"{\n"+
                // offset(offDepth+1)+"size_t idx_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+".size();\n"+
                // offset(offDepth+1)+viewName[outViewID]+
                // // "_map.emplace("+viewVars+",idx_"+viewName[outViewID]+");\n"+
                // "_map[{"+viewVars+"}] = idx_"+viewName[outViewID]+";\n"+
                // offset(offDepth+1)+viewName[outViewID]+
                // ".emplace_back("+viewVars+");\n"+
                // // ".push_back({"+viewVars+"});\n"+
                // offset(offDepth+1)+"aggregates_"+viewName[outViewID]+
                // " = "+viewName[outViewID]+"[idx_"+viewName[outViewID]+
                // "].aggregates;\n"+
                // offset(offDepth)+"}\n";
        }
        else
        {
            // just add string to push to view
            returnString += offset(offDepth)+viewName[outViewID]+
                ".emplace_back("+viewVars+");\n"+offset(offDepth)+
                // ".push_back({"+viewVars+"});\n"+offset(offDepth)+
                "aggregates_"+viewName[outViewID]+" = "+viewName[outViewID]+
                ".back().aggregates;\n";
        }

        if (COMPRESS_AGGREGATES)
        {
            AggregateIndexes bench, aggIdx;
            std::bitset<7> increasingIndexes;
        
            mapAggregateToIndexes(bench,aggregateComputation[outViewID][0],
                                  outViewID,maxDepth);
        
            size_t off = 0;
            for (size_t aggID = 1; aggID <
                     aggregateComputation[outViewID].size(); ++aggID)
            {
                const AggregateTuple& tuple = aggregateComputation[outViewID][aggID];

                aggIdx.reset();
                mapAggregateToIndexes(aggIdx,tuple,outViewID,maxDepth);

                // if (outViewID == 0)
                //     std::cout << aggID << " : " << increasingIndexes << std::endl;

                if (aggIdx.isIncrement(bench,off,increasingIndexes))
                {
                    ++off;
                }
                else
                {
                    // If not, output bench and all offset aggregates
                    returnString += outputFinalRegTupleString(
                        bench,off,increasingIndexes,offDepth);
                
                    // make aggregate the bench and set offset to 0
                    bench = aggIdx;
                    off = 0;
                    increasingIndexes.reset();
                }
            }

            // If not, output bench and all offset
            // aggregateString
            returnString += outputFinalRegTupleString(
                bench,off,increasingIndexes,offDepth);
        }
        else 
        {
            for(const AggregateTuple& aggTuple : aggregateComputation[outViewID])
            {
                returnString += offset(offDepth)+"aggregates_"+
                    viewName[outViewID]+"["+std::to_string(aggTuple.aggID)+
                    "] += ";

                std::string aggBody = "";
                if (aggTuple.local.first < maxDepth)
                {
                    const ProductAggregate& prodAgg =
                        productToVariableRegister[aggTuple.local.first]
                        [aggTuple.local.second];
        
                    const std::pair<size_t,size_t>& correspondingLoopAgg =
                        prodAgg.correspondingLoopAgg;
                    
                    std::string prev = std::to_string(
                        newAggregateRemapping[aggTuple.local.first]
                        [correspondingLoopAgg.first]
                        [correspondingLoopAgg.second]);
                
                    aggBody += "aggregateRegister["+prev+"]*";
                }
                if (aggTuple.post.first < maxDepth)
                {
                    std::string post = std::to_string(
                        postRemapping[aggTuple.post.first]
                        [aggTuple.post.second]);
                    aggBody += "postRegister["+post+"]*";
                }

                if (aggTuple.hasDependentComputation)
                {
                    const std::pair<size_t,size_t>& correspondingLoopAgg =
                        aggTuple.dependentProdAgg.correspondingLoopAgg;
                
                    std::string prev = std::to_string(
                        depAggregateRemapping[correspondingLoopAgg.first]
                        [correspondingLoopAgg.second]);

                    aggBody += "aggregateRegister["+prev+"]*";
                }
                // TODO:TODO:TODO: ---> make sure this is correct
                if (aggBody.empty())
                    aggBody = "1*";
                returnString += aggBody;
                returnString.pop_back();
                returnString += ";\n";            
            }
        }

        outViewID = depLoop.outView.find_next(outViewID);
    }

    return returnString;
}